

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

bool embree::avx2::CurveNiIntersector1<4>::
     occluded_t<embree::avx2::RibbonCurve1Intersector1<embree::BezierCurveT,8>,embree::avx2::Occluded1EpilogMU<8,true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  undefined1 (*pauVar1) [16];
  undefined1 (*pauVar2) [16];
  undefined1 (*pauVar3) [16];
  undefined1 (*pauVar4) [12];
  undefined1 (*pauVar5) [28];
  float *pfVar6;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar7;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar9;
  Primitive PVar10;
  int iVar11;
  Geometry *pGVar12;
  RTCFilterFunctionN p_Var13;
  undefined1 auVar14 [32];
  float fVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  long lVar26;
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [28];
  uint uVar88;
  RTCIntersectArguments *pRVar89;
  ulong uVar90;
  Geometry *geometry;
  long lVar91;
  ulong uVar92;
  long lVar93;
  byte bVar94;
  undefined4 uVar95;
  undefined8 unaff_R14;
  ulong uVar96;
  undefined8 uVar97;
  float fVar111;
  vint4 bi_2;
  undefined1 auVar98 [16];
  float fVar110;
  float fVar112;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  float fVar113;
  float fVar114;
  float fVar115;
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar102 [16];
  undefined1 auVar109 [32];
  vint4 bi_1;
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [64];
  float fVar128;
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  vint4 ai_2;
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [64];
  vint4 ai;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [32];
  vint4 bi;
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  vint4 ai_1;
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [64];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [64];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [64];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar186 [32];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar187 [64];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [64];
  undefined1 auVar191 [16];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [64];
  undefined1 auVar196 [16];
  undefined1 auVar197 [64];
  float fVar198;
  float fVar204;
  undefined1 auVar199 [16];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [64];
  undefined1 auVar205 [64];
  RTCFilterFunctionNArguments args;
  int local_794;
  long local_790;
  Primitive *local_788;
  undefined1 local_780 [8];
  undefined1 auStack_778 [8];
  float fStack_770;
  float fStack_76c;
  float fStack_768;
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  ulong local_710;
  Precalculations *local_708;
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 local_5f0;
  undefined8 uStack_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  RTCFilterFunctionNArguments local_5d0;
  undefined1 local_5a0 [32];
  float local_580;
  float fStack_57c;
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  float local_560;
  float fStack_55c;
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined8 local_4e0;
  undefined4 local_4d8;
  float local_4d4;
  undefined4 local_4d0;
  undefined4 local_4cc;
  undefined4 local_4c8;
  uint local_4c4;
  uint local_4c0;
  ulong local_4a8;
  float local_4a0;
  float fStack_49c;
  float fStack_498;
  float fStack_494;
  ulong local_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  float local_340;
  float fStack_33c;
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  int iStack_324;
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [16];
  undefined1 local_290 [16];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  int local_220;
  int local_21c;
  undefined8 local_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  float local_1a0 [4];
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined1 local_160 [32];
  float local_140;
  float fStack_13c;
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  float fStack_124;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined1 local_100 [32];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 auVar183 [64];
  undefined1 auVar200 [16];
  
  local_708 = pre;
  PVar10 = prim[1];
  uVar90 = (ulong)(byte)PVar10;
  fVar128 = *(float *)(prim + uVar90 * 0x19 + 0x12);
  auVar21 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                       *(undefined1 (*) [16])(prim + uVar90 * 0x19 + 6));
  auVar98._0_4_ = fVar128 * auVar21._0_4_;
  auVar98._4_4_ = fVar128 * auVar21._4_4_;
  auVar98._8_4_ = fVar128 * auVar21._8_4_;
  auVar98._12_4_ = fVar128 * auVar21._12_4_;
  auVar150._0_4_ = fVar128 * (ray->dir).field_0.m128[0];
  auVar150._4_4_ = fVar128 * (ray->dir).field_0.m128[1];
  auVar150._8_4_ = fVar128 * (ray->dir).field_0.m128[2];
  auVar150._12_4_ = fVar128 * (ray->dir).field_0.m128[3];
  auVar21 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar90 * 4 + 6)));
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar90 * 5 + 6)));
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar90 * 6 + 6)));
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar90 * 0xb + 6)));
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar90 * 0xc + 6)));
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar20 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar90 * 0xd + 6)));
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar101 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar90 * 0x12 + 6)));
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar100 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar90 * 0x13 + 6)));
  auVar100 = vcvtdq2ps_avx(auVar100);
  auVar190 = ZEXT1664(auVar100);
  auVar129 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar90 * 0x14 + 6)));
  auVar129 = vcvtdq2ps_avx(auVar129);
  auVar197 = ZEXT1664(auVar129);
  auVar199._4_4_ = auVar150._0_4_;
  auVar199._0_4_ = auVar150._0_4_;
  auVar199._8_4_ = auVar150._0_4_;
  auVar199._12_4_ = auVar150._0_4_;
  auVar117 = vshufps_avx(auVar150,auVar150,0x55);
  auVar99 = vshufps_avx(auVar150,auVar150,0xaa);
  fVar128 = auVar99._0_4_;
  auVar184._0_4_ = fVar128 * auVar17._0_4_;
  fVar110 = auVar99._4_4_;
  auVar184._4_4_ = fVar110 * auVar17._4_4_;
  fVar111 = auVar99._8_4_;
  auVar184._8_4_ = fVar111 * auVar17._8_4_;
  fVar112 = auVar99._12_4_;
  auVar184._12_4_ = fVar112 * auVar17._12_4_;
  auVar175._0_4_ = auVar20._0_4_ * fVar128;
  auVar175._4_4_ = auVar20._4_4_ * fVar110;
  auVar175._8_4_ = auVar20._8_4_ * fVar111;
  auVar175._12_4_ = auVar20._12_4_ * fVar112;
  auVar168._0_4_ = auVar129._0_4_ * fVar128;
  auVar168._4_4_ = auVar129._4_4_ * fVar110;
  auVar168._8_4_ = auVar129._8_4_ * fVar111;
  auVar168._12_4_ = auVar129._12_4_ * fVar112;
  auVar99 = vfmadd231ps_fma(auVar184,auVar117,auVar16);
  auVar130 = vfmadd231ps_fma(auVar175,auVar117,auVar19);
  auVar117 = vfmadd231ps_fma(auVar168,auVar100,auVar117);
  auVar140 = vfmadd231ps_fma(auVar99,auVar199,auVar21);
  auVar187 = ZEXT1664(auVar140);
  auVar130 = vfmadd231ps_fma(auVar130,auVar199,auVar18);
  auVar148 = vfmadd231ps_fma(auVar117,auVar101,auVar199);
  auVar200._4_4_ = auVar98._0_4_;
  auVar200._0_4_ = auVar98._0_4_;
  auVar200._8_4_ = auVar98._0_4_;
  auVar200._12_4_ = auVar98._0_4_;
  auVar203 = ZEXT1664(auVar200);
  auVar117 = vshufps_avx(auVar98,auVar98,0x55);
  auVar99 = vshufps_avx(auVar98,auVar98,0xaa);
  fVar128 = auVar99._0_4_;
  auVar151._0_4_ = fVar128 * auVar17._0_4_;
  fVar110 = auVar99._4_4_;
  auVar151._4_4_ = fVar110 * auVar17._4_4_;
  fVar111 = auVar99._8_4_;
  auVar151._8_4_ = fVar111 * auVar17._8_4_;
  fVar112 = auVar99._12_4_;
  auVar151._12_4_ = fVar112 * auVar17._12_4_;
  auVar116._0_4_ = auVar20._0_4_ * fVar128;
  auVar116._4_4_ = auVar20._4_4_ * fVar110;
  auVar116._8_4_ = auVar20._8_4_ * fVar111;
  auVar116._12_4_ = auVar20._12_4_ * fVar112;
  auVar99._0_4_ = auVar129._0_4_ * fVar128;
  auVar99._4_4_ = auVar129._4_4_ * fVar110;
  auVar99._8_4_ = auVar129._8_4_ * fVar111;
  auVar99._12_4_ = auVar129._12_4_ * fVar112;
  auVar16 = vfmadd231ps_fma(auVar151,auVar117,auVar16);
  auVar17 = vfmadd231ps_fma(auVar116,auVar117,auVar19);
  auVar19 = vfmadd231ps_fma(auVar99,auVar117,auVar100);
  auVar20 = vfmadd231ps_fma(auVar16,auVar200,auVar21);
  auVar100 = vfmadd231ps_fma(auVar17,auVar200,auVar18);
  auVar129 = vfmadd231ps_fma(auVar19,auVar200,auVar101);
  local_290._8_4_ = 0x7fffffff;
  local_290._0_8_ = 0x7fffffff7fffffff;
  local_290._12_4_ = 0x7fffffff;
  auVar21 = vandps_avx(auVar140,local_290);
  auVar147._8_4_ = 0x219392ef;
  auVar147._0_8_ = 0x219392ef219392ef;
  auVar147._12_4_ = 0x219392ef;
  auVar21 = vcmpps_avx(auVar21,auVar147,1);
  auVar16 = vblendvps_avx(auVar140,auVar147,auVar21);
  auVar21 = vandps_avx(auVar130,local_290);
  auVar21 = vcmpps_avx(auVar21,auVar147,1);
  auVar17 = vblendvps_avx(auVar130,auVar147,auVar21);
  auVar21 = vandps_avx(local_290,auVar148);
  auVar21 = vcmpps_avx(auVar21,auVar147,1);
  auVar21 = vblendvps_avx(auVar148,auVar147,auVar21);
  auVar18 = vrcpps_avx(auVar16);
  auVar169._8_4_ = 0x3f800000;
  auVar169._0_8_ = 0x3f8000003f800000;
  auVar169._12_4_ = 0x3f800000;
  auVar16 = vfnmadd213ps_fma(auVar16,auVar18,auVar169);
  auVar18 = vfmadd132ps_fma(auVar16,auVar18,auVar18);
  auVar16 = vrcpps_avx(auVar17);
  auVar17 = vfnmadd213ps_fma(auVar17,auVar16,auVar169);
  auVar19 = vfmadd132ps_fma(auVar17,auVar16,auVar16);
  auVar16 = vrcpps_avx(auVar21);
  auVar17 = vfnmadd213ps_fma(auVar21,auVar16,auVar169);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar90 * 7 + 6);
  auVar21 = vpmovsxwd_avx(auVar21);
  auVar101 = vfmadd132ps_fma(auVar17,auVar16,auVar16);
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar21 = vsubps_avx(auVar21,auVar20);
  auVar148._0_4_ = auVar18._0_4_ * auVar21._0_4_;
  auVar148._4_4_ = auVar18._4_4_ * auVar21._4_4_;
  auVar148._8_4_ = auVar18._8_4_ * auVar21._8_4_;
  auVar148._12_4_ = auVar18._12_4_ * auVar21._12_4_;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar90 * 9 + 6);
  auVar21 = vpmovsxwd_avx(auVar16);
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar16 = vsubps_avx(auVar21,auVar20);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar90 * 0xe + 6);
  auVar21 = vpmovsxwd_avx(auVar17);
  auVar152._0_4_ = auVar18._0_4_ * auVar16._0_4_;
  auVar152._4_4_ = auVar18._4_4_ * auVar16._4_4_;
  auVar152._8_4_ = auVar18._8_4_ * auVar16._8_4_;
  auVar152._12_4_ = auVar18._12_4_ * auVar16._12_4_;
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar21 = vsubps_avx(auVar21,auVar100);
  auVar160._0_4_ = auVar19._0_4_ * auVar21._0_4_;
  auVar160._4_4_ = auVar19._4_4_ * auVar21._4_4_;
  auVar160._8_4_ = auVar19._8_4_ * auVar21._8_4_;
  auVar160._12_4_ = auVar19._12_4_ * auVar21._12_4_;
  auVar130._1_3_ = 0;
  auVar130[0] = PVar10;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar10 * 0x10 + 6);
  auVar21 = vpmovsxwd_avx(auVar18);
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar21 = vsubps_avx(auVar21,auVar100);
  auVar117._0_4_ = auVar19._0_4_ * auVar21._0_4_;
  auVar117._4_4_ = auVar19._4_4_ * auVar21._4_4_;
  auVar117._8_4_ = auVar19._8_4_ * auVar21._8_4_;
  auVar117._12_4_ = auVar19._12_4_ * auVar21._12_4_;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar90 * 0x15 + 6);
  auVar21 = vpmovsxwd_avx(auVar19);
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar16 = vsubps_avx(auVar21,auVar129);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar90 * 0x17 + 6);
  auVar21 = vpmovsxwd_avx(auVar20);
  auVar140._0_4_ = auVar101._0_4_ * auVar16._0_4_;
  auVar140._4_4_ = auVar101._4_4_ * auVar16._4_4_;
  auVar140._8_4_ = auVar101._8_4_ * auVar16._8_4_;
  auVar140._12_4_ = auVar101._12_4_ * auVar16._12_4_;
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar21 = vsubps_avx(auVar21,auVar129);
  auVar100._0_4_ = auVar101._0_4_ * auVar21._0_4_;
  auVar100._4_4_ = auVar101._4_4_ * auVar21._4_4_;
  auVar100._8_4_ = auVar101._8_4_ * auVar21._8_4_;
  auVar100._12_4_ = auVar101._12_4_ * auVar21._12_4_;
  auVar21 = vpminsd_avx(auVar148,auVar152);
  auVar16 = vpminsd_avx(auVar160,auVar117);
  auVar21 = vmaxps_avx(auVar21,auVar16);
  auVar16 = vpminsd_avx(auVar140,auVar100);
  uVar95 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar176._4_4_ = uVar95;
  auVar176._0_4_ = uVar95;
  auVar176._8_4_ = uVar95;
  auVar176._12_4_ = uVar95;
  auVar183 = ZEXT1664(auVar176);
  auVar16 = vmaxps_avx(auVar16,auVar176);
  auVar21 = vmaxps_avx(auVar21,auVar16);
  local_2a0._0_4_ = auVar21._0_4_ * 0.99999964;
  local_2a0._4_4_ = auVar21._4_4_ * 0.99999964;
  local_2a0._8_4_ = auVar21._8_4_ * 0.99999964;
  local_2a0._12_4_ = auVar21._12_4_ * 0.99999964;
  auVar21 = vpmaxsd_avx(auVar148,auVar152);
  auVar16 = vpmaxsd_avx(auVar160,auVar117);
  auVar21 = vminps_avx(auVar21,auVar16);
  auVar16 = vpmaxsd_avx(auVar140,auVar100);
  fVar128 = ray->tfar;
  auVar129._4_4_ = fVar128;
  auVar129._0_4_ = fVar128;
  auVar129._8_4_ = fVar128;
  auVar129._12_4_ = fVar128;
  auVar16 = vminps_avx(auVar16,auVar129);
  auVar21 = vminps_avx(auVar21,auVar16);
  auVar130[4] = PVar10;
  auVar130._5_3_ = 0;
  auVar130[8] = PVar10;
  auVar130._9_3_ = 0;
  auVar130[0xc] = PVar10;
  auVar130._13_3_ = 0;
  auVar16 = vpcmpgtd_avx(auVar130,_DAT_01f4ad30);
  auVar101._0_4_ = auVar21._0_4_ * 1.0000004;
  auVar101._4_4_ = auVar21._4_4_ * 1.0000004;
  auVar101._8_4_ = auVar21._8_4_ * 1.0000004;
  auVar101._12_4_ = auVar21._12_4_ * 1.0000004;
  auVar21 = vcmpps_avx(local_2a0,auVar101,2);
  auVar21 = vandps_avx(auVar21,auVar16);
  uVar95 = vmovmskps_avx(auVar21);
  local_480 = mm_lookupmask_ps._16_8_;
  uStack_478 = mm_lookupmask_ps._24_8_;
  uStack_470 = mm_lookupmask_ps._16_8_;
  uStack_468 = mm_lookupmask_ps._24_8_;
  local_488 = CONCAT44((int)((ulong)unaff_R14 >> 0x20),uVar95);
  local_788 = prim;
  while (auVar125 = local_3c0, local_488 != 0) {
    auVar124 = auVar197._0_32_;
    auVar186 = auVar187._0_32_;
    local_6c0 = auVar183._0_32_;
    local_680 = auVar190._0_32_;
    lVar93 = 0;
    for (uVar90 = local_488; (uVar90 & 1) == 0; uVar90 = uVar90 >> 1 | 0x8000000000000000) {
      lVar93 = lVar93 + 1;
    }
    local_710 = (ulong)*(uint *)(local_788 + 2);
    pGVar12 = (context->scene->geometries).items[*(uint *)(local_788 + 2)].ptr;
    local_4a8 = (ulong)*(uint *)(local_788 + lVar93 * 4 + 6);
    uVar90 = (ulong)*(uint *)(*(long *)&pGVar12->field_0x58 +
                             pGVar12[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>
                             ._M_i * (ulong)*(uint *)(local_788 + lVar93 * 4 + 6));
    p_Var13 = pGVar12[1].intersectionFilterN;
    lVar93 = *(long *)&pGVar12[1].time_range.upper;
    pauVar1 = (undefined1 (*) [16])(lVar93 + (long)p_Var13 * uVar90);
    local_5e0 = *(undefined8 *)*pauVar1;
    uStack_5d8 = *(undefined8 *)(*pauVar1 + 8);
    pauVar2 = (undefined1 (*) [16])(lVar93 + (uVar90 + 1) * (long)p_Var13);
    local_5f0 = *(undefined8 *)*pauVar2;
    uStack_5e8 = *(undefined8 *)(*pauVar2 + 8);
    pauVar3 = (undefined1 (*) [16])(lVar93 + (uVar90 + 2) * (long)p_Var13);
    local_600 = *(undefined8 *)*pauVar3;
    uStack_5f8 = *(undefined8 *)(*pauVar3 + 8);
    uVar96 = local_488 - 1 & local_488;
    pauVar4 = (undefined1 (*) [12])(lVar93 + (uVar90 + 3) * (long)p_Var13);
    local_4a0 = (float)*(undefined8 *)*pauVar4;
    fStack_49c = (float)((ulong)*(undefined8 *)*pauVar4 >> 0x20);
    fStack_498 = (float)*(undefined8 *)(*pauVar4 + 8);
    fStack_494 = (float)((ulong)*(undefined8 *)(*pauVar4 + 8) >> 0x20);
    if (uVar96 != 0) {
      uVar92 = uVar96 - 1 & uVar96;
      for (uVar90 = uVar96; (uVar90 & 1) == 0; uVar90 = uVar90 >> 1 | 0x8000000000000000) {
      }
      if (uVar92 != 0) {
        for (; (uVar92 & 1) == 0; uVar92 = uVar92 >> 1 | 0x8000000000000000) {
        }
      }
    }
    iVar11 = (int)pGVar12[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    aVar7 = (ray->org).field_0;
    auVar16 = vsubps_avx(*pauVar1,(undefined1  [16])aVar7);
    uVar95 = auVar16._0_4_;
    auVar141._4_4_ = uVar95;
    auVar141._0_4_ = uVar95;
    auVar141._8_4_ = uVar95;
    auVar141._12_4_ = uVar95;
    auVar21 = vshufps_avx(auVar16,auVar16,0x55);
    auVar16 = vshufps_avx(auVar16,auVar16,0xaa);
    aVar8 = (local_708->ray_space).vx.field_0;
    aVar9 = (local_708->ray_space).vy.field_0;
    fVar128 = (local_708->ray_space).vz.field_0.m128[0];
    fVar110 = (local_708->ray_space).vz.field_0.m128[1];
    fVar111 = (local_708->ray_space).vz.field_0.m128[2];
    fVar112 = (local_708->ray_space).vz.field_0.m128[3];
    auVar153._0_4_ = auVar16._0_4_ * fVar128;
    auVar153._4_4_ = auVar16._4_4_ * fVar110;
    auVar153._8_4_ = auVar16._8_4_ * fVar111;
    auVar153._12_4_ = auVar16._12_4_ * fVar112;
    auVar21 = vfmadd231ps_fma(auVar153,(undefined1  [16])aVar9,auVar21);
    auVar20 = vfmadd231ps_fma(auVar21,(undefined1  [16])aVar8,auVar141);
    auVar21 = vblendps_avx(auVar20,*pauVar1,8);
    auVar17 = vsubps_avx(*pauVar2,(undefined1  [16])aVar7);
    uVar95 = auVar17._0_4_;
    auVar154._4_4_ = uVar95;
    auVar154._0_4_ = uVar95;
    auVar154._8_4_ = uVar95;
    auVar154._12_4_ = uVar95;
    auVar16 = vshufps_avx(auVar17,auVar17,0x55);
    auVar17 = vshufps_avx(auVar17,auVar17,0xaa);
    auVar185._0_4_ = auVar17._0_4_ * fVar128;
    auVar185._4_4_ = auVar17._4_4_ * fVar110;
    auVar185._8_4_ = auVar17._8_4_ * fVar111;
    auVar185._12_4_ = auVar17._12_4_ * fVar112;
    auVar16 = vfmadd231ps_fma(auVar185,(undefined1  [16])aVar9,auVar16);
    auVar101 = vfmadd231ps_fma(auVar16,(undefined1  [16])aVar8,auVar154);
    auVar16 = vblendps_avx(auVar101,*pauVar2,8);
    auVar18 = vsubps_avx(*pauVar3,(undefined1  [16])aVar7);
    uVar95 = auVar18._0_4_;
    auVar161._4_4_ = uVar95;
    auVar161._0_4_ = uVar95;
    auVar161._8_4_ = uVar95;
    auVar161._12_4_ = uVar95;
    auVar17 = vshufps_avx(auVar18,auVar18,0x55);
    auVar18 = vshufps_avx(auVar18,auVar18,0xaa);
    auVar191._0_4_ = auVar18._0_4_ * fVar128;
    auVar191._4_4_ = auVar18._4_4_ * fVar110;
    auVar191._8_4_ = auVar18._8_4_ * fVar111;
    auVar191._12_4_ = auVar18._12_4_ * fVar112;
    auVar17 = vfmadd231ps_fma(auVar191,(undefined1  [16])aVar9,auVar17);
    auVar100 = vfmadd231ps_fma(auVar17,(undefined1  [16])aVar8,auVar161);
    auVar17 = vblendps_avx(auVar100,*pauVar3,8);
    auVar83._12_4_ = fStack_494;
    auVar83._0_12_ = *pauVar4;
    auVar19 = vsubps_avx(auVar83,(undefined1  [16])aVar7);
    uVar95 = auVar19._0_4_;
    auVar170._4_4_ = uVar95;
    auVar170._0_4_ = uVar95;
    auVar170._8_4_ = uVar95;
    auVar170._12_4_ = uVar95;
    auVar18 = vshufps_avx(auVar19,auVar19,0x55);
    auVar19 = vshufps_avx(auVar19,auVar19,0xaa);
    auVar196._0_4_ = auVar19._0_4_ * fVar128;
    auVar196._4_4_ = auVar19._4_4_ * fVar110;
    auVar196._8_4_ = auVar19._8_4_ * fVar111;
    auVar196._12_4_ = auVar19._12_4_ * fVar112;
    auVar18 = vfmadd231ps_fma(auVar196,(undefined1  [16])aVar9,auVar18);
    auVar129 = vfmadd231ps_fma(auVar18,(undefined1  [16])aVar8,auVar170);
    auVar18 = vblendps_avx(auVar129,auVar83,8);
    auVar21 = vandps_avx(auVar21,local_290);
    auVar16 = vandps_avx(auVar16,local_290);
    auVar19 = vmaxps_avx(auVar21,auVar16);
    auVar21 = vandps_avx(auVar17,local_290);
    auVar16 = vandps_avx(auVar18,local_290);
    auVar21 = vmaxps_avx(auVar21,auVar16);
    auVar21 = vmaxps_avx(auVar19,auVar21);
    auVar16 = vmovshdup_avx(auVar21);
    auVar16 = vmaxss_avx(auVar16,auVar21);
    auVar21 = vshufpd_avx(auVar21,auVar21,1);
    auVar21 = vmaxss_avx(auVar21,auVar16);
    local_790 = (long)iVar11;
    lVar93 = local_790 * 0x44;
    auVar16 = vmovshdup_avx(auVar20);
    uVar97 = auVar16._0_8_;
    local_460._8_8_ = uVar97;
    local_460._0_8_ = uVar97;
    local_460._16_8_ = uVar97;
    local_460._24_8_ = uVar97;
    auVar16 = vmovshdup_avx(auVar101);
    uVar97 = auVar16._0_8_;
    local_640._8_8_ = uVar97;
    local_640._0_8_ = uVar97;
    local_640._16_8_ = uVar97;
    local_640._24_8_ = uVar97;
    auVar137 = *(undefined1 (*) [32])(bezier_basis0 + lVar93 + 0x908);
    local_6a0._0_4_ = auVar100._0_4_;
    local_6a0._4_4_ = local_6a0._0_4_;
    local_6a0._8_4_ = local_6a0._0_4_;
    local_6a0._12_4_ = local_6a0._0_4_;
    local_6a0._16_4_ = local_6a0._0_4_;
    local_6a0._20_4_ = local_6a0._0_4_;
    local_6a0._24_4_ = local_6a0._0_4_;
    local_6a0._28_4_ = local_6a0._0_4_;
    auVar16 = vmovshdup_avx(auVar100);
    uVar97 = auVar16._0_8_;
    local_5a0._8_8_ = uVar97;
    local_5a0._0_8_ = uVar97;
    local_5a0._16_8_ = uVar97;
    local_5a0._24_8_ = uVar97;
    fVar112 = *(float *)*(undefined1 (*) [28])(bezier_basis0 + lVar93 + 0xd8c);
    fVar204 = *(float *)(bezier_basis0 + lVar93 + 0xd90);
    fVar72 = *(float *)(bezier_basis0 + lVar93 + 0xd94);
    fVar73 = *(float *)(bezier_basis0 + lVar93 + 0xd98);
    fVar74 = *(float *)(bezier_basis0 + lVar93 + 0xd9c);
    fVar75 = *(float *)(bezier_basis0 + lVar93 + 0xda0);
    fVar76 = *(float *)(bezier_basis0 + lVar93 + 0xda4);
    auVar87 = *(undefined1 (*) [28])(bezier_basis0 + lVar93 + 0xd8c);
    local_560 = auVar129._0_4_;
    auVar16 = vmovshdup_avx(auVar129);
    auVar183._0_4_ = fVar112 * local_560;
    auVar183._4_4_ = fVar204 * local_560;
    auVar183._8_4_ = fVar72 * local_560;
    auVar183._12_4_ = fVar73 * local_560;
    auVar183._16_4_ = fVar74 * local_560;
    auVar183._20_4_ = fVar75 * local_560;
    auVar183._28_36_ = auVar203._28_36_;
    auVar183._24_4_ = fVar76 * local_560;
    local_580 = auVar16._0_4_;
    auVar103._0_4_ = fVar112 * local_580;
    fStack_57c = auVar16._4_4_;
    auVar103._4_4_ = fVar204 * fStack_57c;
    auVar103._8_4_ = fVar72 * local_580;
    auVar103._12_4_ = fVar73 * fStack_57c;
    auVar103._16_4_ = fVar74 * local_580;
    auVar103._20_4_ = fVar75 * fStack_57c;
    auVar103._24_4_ = fVar76 * local_580;
    auVar103._28_4_ = 0;
    auVar17 = vfmadd231ps_fma(auVar183._0_32_,auVar137,local_6a0);
    auVar18 = vfmadd231ps_fma(auVar103,auVar137,local_5a0);
    auVar103 = *(undefined1 (*) [32])(bezier_basis0 + lVar93 + 0x484);
    uVar95 = auVar101._0_4_;
    local_620._4_4_ = uVar95;
    local_620._0_4_ = uVar95;
    local_620._8_4_ = uVar95;
    local_620._12_4_ = uVar95;
    local_620._16_4_ = uVar95;
    local_620._20_4_ = uVar95;
    local_620._24_4_ = uVar95;
    local_620._28_4_ = uVar95;
    auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar103,local_620);
    auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar103,local_640);
    auVar182 = *(undefined1 (*) [32])(bezier_basis0 + lVar93);
    uVar95 = auVar20._0_4_;
    local_500._4_4_ = uVar95;
    local_500._0_4_ = uVar95;
    local_500._8_4_ = uVar95;
    local_500._12_4_ = uVar95;
    local_500._16_4_ = uVar95;
    local_500._20_4_ = uVar95;
    local_500._24_4_ = uVar95;
    local_500._28_4_ = uVar95;
    auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar182,local_500);
    auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar182,local_460);
    auVar136 = *(undefined1 (*) [32])(bezier_basis1 + lVar93 + 0x908);
    local_340 = *(float *)(bezier_basis1 + lVar93 + 0xd8c);
    fStack_33c = *(float *)(bezier_basis1 + lVar93 + 0xd90);
    fStack_338 = *(float *)(bezier_basis1 + lVar93 + 0xd94);
    fStack_334 = *(float *)(bezier_basis1 + lVar93 + 0xd98);
    fStack_330 = *(float *)(bezier_basis1 + lVar93 + 0xd9c);
    fStack_32c = *(float *)(bezier_basis1 + lVar93 + 0xda0);
    fStack_328 = *(float *)(bezier_basis1 + lVar93 + 0xda4);
    fStack_55c = local_560;
    fStack_558 = local_560;
    fStack_554 = local_560;
    fStack_550 = local_560;
    fStack_54c = local_560;
    fStack_548 = local_560;
    fStack_544 = local_560;
    auVar109._4_4_ = fStack_33c * local_560;
    auVar109._0_4_ = local_340 * local_560;
    auVar109._8_4_ = fStack_338 * local_560;
    auVar109._12_4_ = fStack_334 * local_560;
    auVar109._16_4_ = fStack_330 * local_560;
    auVar109._20_4_ = fStack_32c * local_560;
    auVar109._24_4_ = fStack_328 * local_560;
    auVar109._28_4_ = local_560;
    auVar19 = vfmadd231ps_fma(auVar109,auVar136,local_6a0);
    auVar178._4_4_ = fStack_33c * fStack_57c;
    auVar178._0_4_ = local_340 * local_580;
    auVar178._8_4_ = fStack_338 * local_580;
    auVar178._12_4_ = fStack_334 * fStack_57c;
    auVar178._16_4_ = fStack_330 * local_580;
    auVar178._20_4_ = fStack_32c * fStack_57c;
    auVar178._24_4_ = fStack_328 * local_580;
    auVar178._28_4_ = fStack_57c;
    auVar117 = vfmadd231ps_fma(auVar178,auVar136,local_5a0);
    auVar109 = *(undefined1 (*) [32])(bezier_basis1 + lVar93 + 0x484);
    auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar109,local_620);
    auVar117 = vfmadd231ps_fma(ZEXT1632(auVar117),auVar109,local_640);
    auVar178 = *(undefined1 (*) [32])(bezier_basis1 + lVar93);
    auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar178,local_500);
    auVar117 = vfmadd231ps_fma(ZEXT1632(auVar117),auVar178,local_460);
    local_2e0 = ZEXT1632(auVar19);
    local_320 = ZEXT1632(auVar17);
    auVar22 = vsubps_avx(local_2e0,local_320);
    local_300 = ZEXT1632(auVar117);
    auVar104 = ZEXT1632(auVar18);
    auVar23 = vsubps_avx(local_300,auVar104);
    auVar105._0_4_ = auVar18._0_4_ * auVar22._0_4_;
    auVar105._4_4_ = auVar18._4_4_ * auVar22._4_4_;
    auVar105._8_4_ = auVar18._8_4_ * auVar22._8_4_;
    auVar105._12_4_ = auVar18._12_4_ * auVar22._12_4_;
    auVar105._16_4_ = auVar22._16_4_ * 0.0;
    auVar105._20_4_ = auVar22._20_4_ * 0.0;
    auVar105._24_4_ = auVar22._24_4_ * 0.0;
    auVar105._28_4_ = 0;
    fVar128 = auVar23._0_4_;
    auVar118._0_4_ = auVar17._0_4_ * fVar128;
    fVar111 = auVar23._4_4_;
    auVar118._4_4_ = auVar17._4_4_ * fVar111;
    fVar113 = auVar23._8_4_;
    auVar118._8_4_ = auVar17._8_4_ * fVar113;
    fVar114 = auVar23._12_4_;
    auVar118._12_4_ = auVar17._12_4_ * fVar114;
    fVar115 = auVar23._16_4_;
    auVar118._16_4_ = fVar115 * 0.0;
    fVar15 = auVar23._20_4_;
    auVar118._20_4_ = fVar15 * 0.0;
    fVar198 = auVar23._24_4_;
    auVar118._24_4_ = fVar198 * 0.0;
    auVar118._28_4_ = 0;
    auVar105 = vsubps_avx(auVar105,auVar118);
    auVar17 = vpermilps_avx(*pauVar1,0xff);
    uVar97 = auVar17._0_8_;
    local_80._8_8_ = uVar97;
    local_80._0_8_ = uVar97;
    local_80._16_8_ = uVar97;
    local_80._24_8_ = uVar97;
    auVar18 = vpermilps_avx(*pauVar2,0xff);
    uVar97 = auVar18._0_8_;
    local_a0._8_8_ = uVar97;
    local_a0._0_8_ = uVar97;
    local_a0._16_8_ = uVar97;
    local_a0._24_8_ = uVar97;
    auVar18 = vpermilps_avx(*pauVar3,0xff);
    uVar97 = auVar18._0_8_;
    local_c0._8_8_ = uVar97;
    local_c0._0_8_ = uVar97;
    local_c0._16_8_ = uVar97;
    local_c0._24_8_ = uVar97;
    auVar84._12_4_ = fStack_494;
    auVar84._0_12_ = *pauVar4;
    auVar18 = vpermilps_avx(auVar84,0xff);
    local_e0 = auVar18._0_8_;
    fVar110 = auVar18._0_4_;
    auVar162._0_4_ = fVar112 * fVar110;
    fVar112 = auVar18._4_4_;
    auVar162._4_4_ = fVar204 * fVar112;
    auVar162._8_4_ = fVar72 * fVar110;
    auVar162._12_4_ = fVar73 * fVar112;
    auVar162._16_4_ = fVar74 * fVar110;
    auVar162._20_4_ = fVar75 * fVar112;
    auVar162._24_4_ = fVar76 * fVar110;
    auVar162._28_4_ = 0;
    auVar18 = vfmadd231ps_fma(auVar162,local_c0,auVar137);
    auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar103,local_a0);
    auVar19 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar182,local_80);
    uStack_d8 = local_e0;
    uStack_d0 = local_e0;
    uStack_c8 = local_e0;
    iStack_324 = *(undefined4 *)(bezier_basis1 + lVar93 + 0xda8);
    auVar14._4_4_ = fStack_33c * fVar112;
    auVar14._0_4_ = local_340 * fVar110;
    auVar14._8_4_ = fStack_338 * fVar110;
    auVar14._12_4_ = fStack_334 * fVar112;
    auVar14._16_4_ = fStack_330 * fVar110;
    auVar14._20_4_ = fStack_32c * fVar112;
    auVar14._24_4_ = fStack_328 * fVar110;
    auVar14._28_4_ = auVar182._28_4_;
    auVar18 = vfmadd231ps_fma(auVar14,auVar136,local_c0);
    auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar109,local_a0);
    auVar117 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar178,local_80);
    auVar25._4_4_ = fVar111 * fVar111;
    auVar25._0_4_ = fVar128 * fVar128;
    auVar25._8_4_ = fVar113 * fVar113;
    auVar25._12_4_ = fVar114 * fVar114;
    auVar25._16_4_ = fVar115 * fVar115;
    auVar25._20_4_ = fVar15 * fVar15;
    auVar25._24_4_ = fVar198 * fVar198;
    auVar25._28_4_ = auVar17._4_4_;
    auVar17 = vfmadd231ps_fma(auVar25,auVar22,auVar22);
    auVar14 = vmaxps_avx(ZEXT1632(auVar19),ZEXT1632(auVar117));
    auVar24._4_4_ = auVar17._4_4_ * auVar14._4_4_ * auVar14._4_4_;
    auVar24._0_4_ = auVar17._0_4_ * auVar14._0_4_ * auVar14._0_4_;
    auVar24._8_4_ = auVar17._8_4_ * auVar14._8_4_ * auVar14._8_4_;
    auVar24._12_4_ = auVar17._12_4_ * auVar14._12_4_ * auVar14._12_4_;
    auVar24._16_4_ = auVar14._16_4_ * auVar14._16_4_ * 0.0;
    auVar24._20_4_ = auVar14._20_4_ * auVar14._20_4_ * 0.0;
    auVar24._24_4_ = auVar14._24_4_ * auVar14._24_4_ * 0.0;
    auVar24._28_4_ = auVar14._28_4_;
    auVar27._4_4_ = auVar105._4_4_ * auVar105._4_4_;
    auVar27._0_4_ = auVar105._0_4_ * auVar105._0_4_;
    auVar27._8_4_ = auVar105._8_4_ * auVar105._8_4_;
    auVar27._12_4_ = auVar105._12_4_ * auVar105._12_4_;
    auVar27._16_4_ = auVar105._16_4_ * auVar105._16_4_;
    auVar27._20_4_ = auVar105._20_4_ * auVar105._20_4_;
    auVar27._24_4_ = auVar105._24_4_ * auVar105._24_4_;
    auVar27._28_4_ = auVar105._28_4_;
    auVar14 = vcmpps_avx(auVar27,auVar24,2);
    fVar128 = auVar21._0_4_ * 4.7683716e-07;
    auVar119._0_4_ = (float)iVar11;
    local_3c0._4_12_ = auVar129._4_12_;
    local_3c0._0_4_ = auVar119._0_4_;
    local_3c0._16_16_ = auVar125._16_16_;
    auVar119._4_4_ = auVar119._0_4_;
    auVar119._8_4_ = auVar119._0_4_;
    auVar119._12_4_ = auVar119._0_4_;
    auVar119._16_4_ = auVar119._0_4_;
    auVar119._20_4_ = auVar119._0_4_;
    auVar119._24_4_ = auVar119._0_4_;
    auVar119._28_4_ = auVar119._0_4_;
    auVar125 = vcmpps_avx(_DAT_01f7b060,auVar119,1);
    auVar17 = vpermilps_avx(auVar20,0xaa);
    uVar97 = auVar17._0_8_;
    local_440._8_8_ = uVar97;
    local_440._0_8_ = uVar97;
    local_440._16_8_ = uVar97;
    local_440._24_8_ = uVar97;
    auVar18 = vpermilps_avx(auVar101,0xaa);
    uVar97 = auVar18._0_8_;
    local_100._8_8_ = uVar97;
    local_100._0_8_ = uVar97;
    local_100._16_8_ = uVar97;
    local_100._24_8_ = uVar97;
    auVar21 = vpermilps_avx(auVar100,0xaa);
    uVar97 = auVar21._0_8_;
    local_2c0._8_8_ = uVar97;
    local_2c0._0_8_ = uVar97;
    local_2c0._16_8_ = uVar97;
    local_2c0._24_8_ = uVar97;
    auVar21 = vshufps_avx(auVar129,auVar129,0xaa);
    uVar97 = auVar21._0_8_;
    register0x00001588 = uVar97;
    local_540 = uVar97;
    register0x00001590 = uVar97;
    register0x00001598 = uVar97;
    auVar105 = auVar125 & auVar14;
    local_520._0_16_ = vpermilps_avx((undefined1  [16])aVar7,0xff);
    auVar25 = local_520;
    local_740._0_16_ = ZEXT416((uint)fVar128);
    fStack_578 = local_580;
    fStack_574 = fStack_57c;
    fStack_570 = local_580;
    fStack_56c = fStack_57c;
    fStack_568 = local_580;
    fStack_564 = fStack_57c;
    local_520 = auVar25;
    if ((((((((auVar105 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar105 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar105 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar105 >> 0x7f,0) == '\0') &&
          (auVar105 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar105 >> 0xbf,0) == '\0') &&
        (auVar105 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar105[0x1f])
    {
      auVar187 = ZEXT3264(auVar186);
      auVar197 = ZEXT3264(auVar124);
LAB_011a00d1:
      auVar203 = ZEXT3264(_local_540);
      auVar195 = ZEXT3264(local_6a0);
      auVar190 = ZEXT3264(local_680);
      auVar183 = ZEXT3264(local_6c0);
      auVar205 = ZEXT3264(local_5a0);
      bVar94 = 0;
      auVar167 = ZEXT3264(CONCAT428(local_560,
                                    CONCAT424(local_560,
                                              CONCAT420(local_560,
                                                        CONCAT416(local_560,
                                                                  CONCAT412(local_560,
                                                                            CONCAT48(local_560,
                                                                                     CONCAT44(
                                                  local_560,local_560))))))));
      auVar171 = ZEXT3264(CONCAT428(fStack_57c,
                                    CONCAT424(local_580,
                                              CONCAT420(fStack_57c,
                                                        CONCAT416(local_580,
                                                                  CONCAT412(fStack_57c,
                                                                            CONCAT48(local_580,
                                                                                     auVar16._0_8_))
                                                                 )))));
      auVar174 = ZEXT3264(local_620);
      auVar146 = ZEXT3264(local_500);
    }
    else {
      local_360 = vandps_avx(auVar125,auVar14);
      fVar198 = auVar21._0_4_;
      fVar204 = auVar21._4_4_;
      auVar125._4_4_ = fVar204 * fStack_33c;
      auVar125._0_4_ = fVar198 * local_340;
      auVar125._8_4_ = fVar198 * fStack_338;
      auVar125._12_4_ = fVar204 * fStack_334;
      auVar125._16_4_ = fVar198 * fStack_330;
      auVar125._20_4_ = fVar204 * fStack_32c;
      auVar125._24_4_ = fVar198 * fStack_328;
      auVar125._28_4_ = local_360._28_4_;
      auVar21 = vfmadd213ps_fma(auVar136,local_2c0,auVar125);
      auVar21 = vfmadd213ps_fma(auVar109,local_100,ZEXT1632(auVar21));
      auVar21 = vfmadd213ps_fma(auVar178,local_440,ZEXT1632(auVar21));
      local_420._0_4_ = auVar87._0_4_;
      local_420._4_4_ = auVar87._4_4_;
      fStack_418 = auVar87._8_4_;
      fStack_414 = auVar87._12_4_;
      fStack_410 = auVar87._16_4_;
      fStack_40c = auVar87._20_4_;
      fStack_408 = auVar87._24_4_;
      auVar106._0_4_ = fVar198 * (float)local_420._0_4_;
      auVar106._4_4_ = fVar204 * (float)local_420._4_4_;
      auVar106._8_4_ = fVar198 * fStack_418;
      auVar106._12_4_ = fVar204 * fStack_414;
      auVar106._16_4_ = fVar198 * fStack_410;
      auVar106._20_4_ = fVar204 * fStack_40c;
      auVar106._24_4_ = fVar198 * fStack_408;
      auVar106._28_4_ = 0;
      auVar20 = vfmadd213ps_fma(auVar137,local_2c0,auVar106);
      auVar20 = vfmadd213ps_fma(auVar103,local_100,ZEXT1632(auVar20));
      auVar125 = *(undefined1 (*) [32])(bezier_basis0 + lVar93 + 0x1210);
      auVar137 = *(undefined1 (*) [32])(bezier_basis0 + lVar93 + 0x1694);
      auVar103 = *(undefined1 (*) [32])(bezier_basis0 + lVar93 + 0x1b18);
      fVar110 = *(float *)(bezier_basis0 + lVar93 + 0x1f9c);
      fVar111 = *(float *)(bezier_basis0 + lVar93 + 0x1fa0);
      fVar112 = *(float *)(bezier_basis0 + lVar93 + 0x1fa4);
      fVar113 = *(float *)(bezier_basis0 + lVar93 + 0x1fa8);
      fVar114 = *(float *)(bezier_basis0 + lVar93 + 0x1fac);
      fVar115 = *(float *)(bezier_basis0 + lVar93 + 0x1fb0);
      fVar15 = *(float *)(bezier_basis0 + lVar93 + 0x1fb4);
      auVar135._0_4_ = local_560 * fVar110;
      auVar135._4_4_ = local_560 * fVar111;
      auVar135._8_4_ = local_560 * fVar112;
      auVar135._12_4_ = local_560 * fVar113;
      auVar135._16_4_ = local_560 * fVar114;
      auVar135._20_4_ = local_560 * fVar115;
      auVar135._24_4_ = local_560 * fVar15;
      auVar135._28_4_ = 0;
      _local_420 = auVar22;
      auVar136._4_4_ = fStack_57c * fVar111;
      auVar136._0_4_ = local_580 * fVar110;
      auVar136._8_4_ = local_580 * fVar112;
      auVar136._12_4_ = fStack_57c * fVar113;
      auVar136._16_4_ = local_580 * fVar114;
      auVar136._20_4_ = fStack_57c * fVar115;
      auVar136._24_4_ = local_580 * fVar15;
      auVar136._28_4_ = auVar22._28_4_;
      auVar28._4_4_ = fVar204 * fVar111;
      auVar28._0_4_ = fVar198 * fVar110;
      auVar28._8_4_ = fVar198 * fVar112;
      auVar28._12_4_ = fVar204 * fVar113;
      auVar28._16_4_ = fVar198 * fVar114;
      auVar28._20_4_ = fVar204 * fVar115;
      auVar28._24_4_ = fVar198 * fVar15;
      auVar28._28_4_ = *(undefined4 *)(bezier_basis0 + lVar93 + 0x1fb8);
      auVar101 = vfmadd231ps_fma(auVar135,auVar103,local_6a0);
      auVar100 = vfmadd231ps_fma(auVar136,auVar103,local_5a0);
      auVar129 = vfmadd231ps_fma(auVar28,local_2c0,auVar103);
      auVar101 = vfmadd231ps_fma(ZEXT1632(auVar101),auVar137,local_620);
      auVar100 = vfmadd231ps_fma(ZEXT1632(auVar100),auVar137,local_640);
      auVar129 = vfmadd231ps_fma(ZEXT1632(auVar129),local_100,auVar137);
      auVar101 = vfmadd231ps_fma(ZEXT1632(auVar101),auVar125,local_500);
      auVar100 = vfmadd231ps_fma(ZEXT1632(auVar100),auVar125,local_460);
      auVar129 = vfmadd231ps_fma(ZEXT1632(auVar129),local_440,auVar125);
      fVar110 = *(float *)(bezier_basis1 + lVar93 + 0x1f9c);
      fVar111 = *(float *)(bezier_basis1 + lVar93 + 0x1fa0);
      fVar112 = *(float *)(bezier_basis1 + lVar93 + 0x1fa4);
      fVar113 = *(float *)(bezier_basis1 + lVar93 + 0x1fa8);
      fVar114 = *(float *)(bezier_basis1 + lVar93 + 0x1fac);
      fVar115 = *(float *)(bezier_basis1 + lVar93 + 0x1fb0);
      fVar15 = *(float *)(bezier_basis1 + lVar93 + 0x1fb4);
      auVar137._4_4_ = local_560 * fVar111;
      auVar137._0_4_ = local_560 * fVar110;
      auVar137._8_4_ = local_560 * fVar112;
      auVar137._12_4_ = local_560 * fVar113;
      auVar137._16_4_ = local_560 * fVar114;
      auVar137._20_4_ = local_560 * fVar115;
      auVar137._24_4_ = local_560 * fVar15;
      auVar137._28_4_ = auVar103._28_4_;
      auVar29._4_4_ = fStack_57c * fVar111;
      auVar29._0_4_ = local_580 * fVar110;
      auVar29._8_4_ = local_580 * fVar112;
      auVar29._12_4_ = fStack_57c * fVar113;
      auVar29._16_4_ = local_580 * fVar114;
      auVar29._20_4_ = fStack_57c * fVar115;
      auVar29._24_4_ = local_580 * fVar15;
      auVar29._28_4_ = auVar17._4_4_;
      auVar30._4_4_ = fVar111 * fVar204;
      auVar30._0_4_ = fVar110 * fVar198;
      auVar30._8_4_ = fVar112 * fVar198;
      auVar30._12_4_ = fVar113 * fVar204;
      auVar30._16_4_ = fVar114 * fVar198;
      auVar30._20_4_ = fVar115 * fVar204;
      auVar30._24_4_ = fVar15 * fVar198;
      auVar30._28_4_ = local_560;
      auVar125 = *(undefined1 (*) [32])(bezier_basis1 + lVar93 + 0x1b18);
      auVar17 = vfmadd231ps_fma(auVar137,auVar125,local_6a0);
      auVar99 = vfmadd231ps_fma(auVar29,auVar125,local_5a0);
      auVar130 = vfmadd231ps_fma(auVar30,local_2c0,auVar125);
      auVar125 = *(undefined1 (*) [32])(bezier_basis1 + lVar93 + 0x1694);
      auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar125,local_620);
      auVar99 = vfmadd231ps_fma(ZEXT1632(auVar99),auVar125,local_640);
      auVar130 = vfmadd231ps_fma(ZEXT1632(auVar130),local_100,auVar125);
      auVar125 = *(undefined1 (*) [32])(bezier_basis1 + lVar93 + 0x1210);
      auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar125,local_500);
      auVar99 = vfmadd231ps_fma(ZEXT1632(auVar99),auVar125,local_460);
      auVar120._8_4_ = 0x7fffffff;
      auVar120._0_8_ = 0x7fffffff7fffffff;
      auVar120._12_4_ = 0x7fffffff;
      auVar120._16_4_ = 0x7fffffff;
      auVar120._20_4_ = 0x7fffffff;
      auVar120._24_4_ = 0x7fffffff;
      auVar120._28_4_ = 0x7fffffff;
      auVar130 = vfmadd231ps_fma(ZEXT1632(auVar130),local_440,auVar125);
      auVar125 = vandps_avx(ZEXT1632(auVar101),auVar120);
      auVar137 = vandps_avx(ZEXT1632(auVar100),auVar120);
      auVar137 = vmaxps_avx(auVar125,auVar137);
      auVar125 = vandps_avx(ZEXT1632(auVar129),auVar120);
      auVar125 = vmaxps_avx(auVar137,auVar125);
      auVar177._4_4_ = fVar128;
      auVar177._0_4_ = fVar128;
      auVar177._8_4_ = fVar128;
      auVar177._12_4_ = fVar128;
      auVar177._16_4_ = fVar128;
      auVar177._20_4_ = fVar128;
      auVar177._24_4_ = fVar128;
      auVar177._28_4_ = fVar128;
      auVar125 = vcmpps_avx(auVar125,auVar177,1);
      auVar103 = vblendvps_avx(ZEXT1632(auVar101),auVar22,auVar125);
      auVar136 = vblendvps_avx(ZEXT1632(auVar100),auVar23,auVar125);
      auVar125 = vandps_avx(ZEXT1632(auVar17),auVar120);
      auVar137 = vandps_avx(ZEXT1632(auVar99),auVar120);
      auVar137 = vmaxps_avx(auVar125,auVar137);
      auVar125 = vandps_avx(ZEXT1632(auVar130),auVar120);
      auVar125 = vmaxps_avx(auVar137,auVar125);
      auVar137 = vcmpps_avx(auVar125,auVar177,1);
      auVar125 = vblendvps_avx(ZEXT1632(auVar17),auVar22,auVar137);
      auVar137 = vblendvps_avx(ZEXT1632(auVar99),auVar23,auVar137);
      auVar17 = vfmadd213ps_fma(auVar182,local_440,ZEXT1632(auVar20));
      auVar20 = vfmadd213ps_fma(auVar103,auVar103,ZEXT832(0) << 0x20);
      auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar136,auVar136);
      auVar182 = vrsqrtps_avx(ZEXT1632(auVar20));
      fVar128 = auVar182._0_4_;
      fVar110 = auVar182._4_4_;
      fVar111 = auVar182._8_4_;
      fVar112 = auVar182._12_4_;
      fVar113 = auVar182._16_4_;
      fVar114 = auVar182._20_4_;
      fVar115 = auVar182._24_4_;
      auVar22._4_4_ = fVar110 * fVar110 * fVar110 * auVar20._4_4_ * -0.5;
      auVar22._0_4_ = fVar128 * fVar128 * fVar128 * auVar20._0_4_ * -0.5;
      auVar22._8_4_ = fVar111 * fVar111 * fVar111 * auVar20._8_4_ * -0.5;
      auVar22._12_4_ = fVar112 * fVar112 * fVar112 * auVar20._12_4_ * -0.5;
      auVar22._16_4_ = fVar113 * fVar113 * fVar113 * -0.0;
      auVar22._20_4_ = fVar114 * fVar114 * fVar114 * -0.0;
      auVar22._24_4_ = fVar115 * fVar115 * fVar115 * -0.0;
      auVar22._28_4_ = 0;
      auVar201._8_4_ = 0x3fc00000;
      auVar201._0_8_ = 0x3fc000003fc00000;
      auVar201._12_4_ = 0x3fc00000;
      auVar201._16_4_ = 0x3fc00000;
      auVar201._20_4_ = 0x3fc00000;
      auVar201._24_4_ = 0x3fc00000;
      auVar201._28_4_ = 0x3fc00000;
      auVar20 = vfmadd231ps_fma(auVar22,auVar201,auVar182);
      fVar128 = auVar20._0_4_;
      fVar110 = auVar20._4_4_;
      auVar23._4_4_ = fVar110 * auVar136._4_4_;
      auVar23._0_4_ = fVar128 * auVar136._0_4_;
      fVar111 = auVar20._8_4_;
      auVar23._8_4_ = fVar111 * auVar136._8_4_;
      fVar112 = auVar20._12_4_;
      auVar23._12_4_ = fVar112 * auVar136._12_4_;
      auVar23._16_4_ = auVar136._16_4_ * 0.0;
      auVar23._20_4_ = auVar136._20_4_ * 0.0;
      auVar23._24_4_ = auVar136._24_4_ * 0.0;
      auVar23._28_4_ = 0;
      auVar31._4_4_ = fVar110 * -auVar103._4_4_;
      auVar31._0_4_ = fVar128 * -auVar103._0_4_;
      auVar31._8_4_ = fVar111 * -auVar103._8_4_;
      auVar31._12_4_ = fVar112 * -auVar103._12_4_;
      auVar31._16_4_ = -auVar103._16_4_ * 0.0;
      auVar31._20_4_ = -auVar103._20_4_ * 0.0;
      auVar31._24_4_ = -auVar103._24_4_ * 0.0;
      auVar31._28_4_ = auVar182._28_4_;
      auVar20 = vfmadd213ps_fma(auVar125,auVar125,ZEXT832(0) << 0x20);
      auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar137,auVar137);
      auVar182 = vrsqrtps_avx(ZEXT1632(auVar20));
      auVar32._28_4_ = auVar18._4_4_;
      auVar32._0_28_ =
           ZEXT1628(CONCAT412(fVar112 * 0.0,
                              CONCAT48(fVar111 * 0.0,CONCAT44(fVar110 * 0.0,fVar128 * 0.0))));
      fVar128 = auVar182._0_4_;
      fVar110 = auVar182._4_4_;
      fVar111 = auVar182._8_4_;
      fVar112 = auVar182._12_4_;
      fVar113 = auVar182._16_4_;
      fVar114 = auVar182._20_4_;
      fVar115 = auVar182._24_4_;
      auVar192._0_4_ = fVar128 * fVar128 * fVar128 * auVar20._0_4_ * -0.5;
      auVar192._4_4_ = fVar110 * fVar110 * fVar110 * auVar20._4_4_ * -0.5;
      auVar192._8_4_ = fVar111 * fVar111 * fVar111 * auVar20._8_4_ * -0.5;
      auVar192._12_4_ = fVar112 * fVar112 * fVar112 * auVar20._12_4_ * -0.5;
      auVar192._16_4_ = fVar113 * fVar113 * fVar113 * -0.0;
      auVar192._20_4_ = fVar114 * fVar114 * fVar114 * -0.0;
      auVar192._24_4_ = fVar115 * fVar115 * fVar115 * -0.0;
      auVar192._28_4_ = 0;
      auVar18 = vfmadd231ps_fma(auVar192,auVar201,auVar182);
      fVar128 = auVar18._0_4_;
      auVar188._0_4_ = auVar137._0_4_ * fVar128;
      fVar110 = auVar18._4_4_;
      auVar188._4_4_ = auVar137._4_4_ * fVar110;
      fVar111 = auVar18._8_4_;
      auVar188._8_4_ = auVar137._8_4_ * fVar111;
      fVar112 = auVar18._12_4_;
      auVar188._12_4_ = auVar137._12_4_ * fVar112;
      auVar188._16_4_ = auVar137._16_4_ * 0.0;
      auVar188._20_4_ = auVar137._20_4_ * 0.0;
      auVar188._24_4_ = auVar137._24_4_ * 0.0;
      auVar188._28_4_ = 0;
      auVar182._4_4_ = fVar110 * -auVar125._4_4_;
      auVar182._0_4_ = fVar128 * -auVar125._0_4_;
      auVar182._8_4_ = fVar111 * -auVar125._8_4_;
      auVar182._12_4_ = fVar112 * -auVar125._12_4_;
      auVar182._16_4_ = -auVar125._16_4_ * 0.0;
      auVar182._20_4_ = -auVar125._20_4_ * 0.0;
      auVar182._24_4_ = -auVar125._24_4_ * 0.0;
      auVar182._28_4_ = auVar103._28_4_ ^ 0x80000000;
      auVar33._28_4_ = 0xbf000000;
      auVar33._0_28_ =
           ZEXT1628(CONCAT412(fVar112 * 0.0,
                              CONCAT48(fVar111 * 0.0,CONCAT44(fVar110 * 0.0,fVar128 * 0.0))));
      auVar18 = vfmadd213ps_fma(auVar23,ZEXT1632(auVar19),local_320);
      auVar125 = ZEXT1632(auVar19);
      auVar20 = vfmadd213ps_fma(auVar31,auVar125,auVar104);
      auVar101 = vfmadd213ps_fma(auVar32,auVar125,ZEXT1632(auVar17));
      auVar99 = vfnmadd213ps_fma(auVar23,auVar125,local_320);
      auVar100 = vfmadd213ps_fma(auVar188,ZEXT1632(auVar117),local_2e0);
      auVar130 = vfnmadd213ps_fma(auVar31,auVar125,auVar104);
      auVar125 = ZEXT1632(auVar117);
      auVar129 = vfmadd213ps_fma(auVar182,auVar125,local_300);
      local_3e0 = ZEXT1632(auVar19);
      auVar98 = vfnmadd231ps_fma(ZEXT1632(auVar17),local_3e0,auVar32);
      auVar17 = vfmadd213ps_fma(auVar33,auVar125,ZEXT1632(auVar21));
      auVar140 = vfnmadd213ps_fma(auVar188,auVar125,local_2e0);
      auVar148 = vfnmadd213ps_fma(auVar182,auVar125,local_300);
      local_400 = ZEXT1632(auVar117);
      auVar116 = vfnmadd231ps_fma(ZEXT1632(auVar21),local_400,auVar33);
      auVar125 = vsubps_avx(ZEXT1632(auVar129),ZEXT1632(auVar130));
      auVar137 = vsubps_avx(ZEXT1632(auVar17),ZEXT1632(auVar98));
      auVar104._4_4_ = auVar98._4_4_ * auVar125._4_4_;
      auVar104._0_4_ = auVar98._0_4_ * auVar125._0_4_;
      auVar104._8_4_ = auVar98._8_4_ * auVar125._8_4_;
      auVar104._12_4_ = auVar98._12_4_ * auVar125._12_4_;
      auVar104._16_4_ = auVar125._16_4_ * 0.0;
      auVar104._20_4_ = auVar125._20_4_ * 0.0;
      auVar104._24_4_ = auVar125._24_4_ * 0.0;
      auVar104._28_4_ = 0;
      auVar19 = vfmsub231ps_fma(auVar104,ZEXT1632(auVar130),auVar137);
      auVar34._4_4_ = auVar137._4_4_ * auVar99._4_4_;
      auVar34._0_4_ = auVar137._0_4_ * auVar99._0_4_;
      auVar34._8_4_ = auVar137._8_4_ * auVar99._8_4_;
      auVar34._12_4_ = auVar137._12_4_ * auVar99._12_4_;
      auVar34._16_4_ = auVar137._16_4_ * 0.0;
      auVar34._20_4_ = auVar137._20_4_ * 0.0;
      auVar34._24_4_ = auVar137._24_4_ * 0.0;
      auVar34._28_4_ = auVar137._28_4_;
      auVar137 = vsubps_avx(ZEXT1632(auVar100),ZEXT1632(auVar99));
      auVar21 = vfmsub231ps_fma(auVar34,ZEXT1632(auVar98),auVar137);
      auVar35._4_4_ = auVar130._4_4_ * auVar137._4_4_;
      auVar35._0_4_ = auVar130._0_4_ * auVar137._0_4_;
      auVar35._8_4_ = auVar130._8_4_ * auVar137._8_4_;
      auVar35._12_4_ = auVar130._12_4_ * auVar137._12_4_;
      auVar35._16_4_ = auVar137._16_4_ * 0.0;
      auVar35._20_4_ = auVar137._20_4_ * 0.0;
      auVar35._24_4_ = auVar137._24_4_ * 0.0;
      auVar35._28_4_ = auVar137._28_4_;
      auVar136 = ZEXT1632(auVar99);
      auVar117 = vfmsub231ps_fma(auVar35,auVar136,auVar125);
      auVar125 = ZEXT1232(ZEXT412(0)) << 0x20;
      auVar21 = vfmadd231ps_fma(ZEXT1632(auVar117),auVar125,ZEXT1632(auVar21));
      auVar21 = vfmadd231ps_fma(ZEXT1632(auVar21),auVar125,ZEXT1632(auVar19));
      auVar14 = vcmpps_avx(ZEXT1632(auVar21),ZEXT1232(ZEXT412(0)) << 0x20,2);
      _local_780 = vblendvps_avx(ZEXT1632(auVar140),ZEXT1632(auVar18),auVar14);
      local_660 = vblendvps_avx(ZEXT1632(auVar148),ZEXT1632(auVar20),auVar14);
      auVar125 = vblendvps_avx(ZEXT1632(auVar116),ZEXT1632(auVar101),auVar14);
      auVar137 = vblendvps_avx(auVar136,ZEXT1632(auVar100),auVar14);
      auVar103 = vblendvps_avx(ZEXT1632(auVar130),ZEXT1632(auVar129),auVar14);
      auVar182 = vblendvps_avx(ZEXT1632(auVar98),ZEXT1632(auVar17),auVar14);
      auVar136 = vblendvps_avx(ZEXT1632(auVar100),auVar136,auVar14);
      auVar109 = vblendvps_avx(ZEXT1632(auVar129),ZEXT1632(auVar130),auVar14);
      auVar21 = vpackssdw_avx(local_360._0_16_,local_360._16_16_);
      local_760 = ZEXT1632(auVar21);
      auVar178 = vblendvps_avx(ZEXT1632(auVar17),ZEXT1632(auVar98),auVar14);
      auVar22 = vsubps_avx(auVar136,_local_780);
      auVar109 = vsubps_avx(auVar109,local_660);
      auVar23 = vsubps_avx(auVar178,auVar125);
      auVar105 = vsubps_avx(_local_780,auVar137);
      auVar25 = vsubps_avx(local_660,auVar103);
      auVar24 = vsubps_avx(auVar125,auVar182);
      auVar36._4_4_ = auVar23._4_4_ * local_780._4_4_;
      auVar36._0_4_ = auVar23._0_4_ * local_780._0_4_;
      auVar36._8_4_ = auVar23._8_4_ * local_780._8_4_;
      auVar36._12_4_ = auVar23._12_4_ * local_780._12_4_;
      auVar36._16_4_ = auVar23._16_4_ * local_780._16_4_;
      auVar36._20_4_ = auVar23._20_4_ * local_780._20_4_;
      auVar36._24_4_ = auVar23._24_4_ * local_780._24_4_;
      auVar36._28_4_ = auVar178._28_4_;
      auVar17 = vfmsub231ps_fma(auVar36,auVar125,auVar22);
      auVar37._4_4_ = auVar22._4_4_ * local_660._4_4_;
      auVar37._0_4_ = auVar22._0_4_ * local_660._0_4_;
      auVar37._8_4_ = auVar22._8_4_ * local_660._8_4_;
      auVar37._12_4_ = auVar22._12_4_ * local_660._12_4_;
      auVar37._16_4_ = auVar22._16_4_ * local_660._16_4_;
      auVar37._20_4_ = auVar22._20_4_ * local_660._20_4_;
      auVar37._24_4_ = auVar22._24_4_ * local_660._24_4_;
      auVar37._28_4_ = auVar136._28_4_;
      auVar18 = vfmsub231ps_fma(auVar37,_local_780,auVar109);
      auVar17 = vfmadd231ps_fma(ZEXT1632(auVar18),ZEXT832(0) << 0x20,ZEXT1632(auVar17));
      auVar107._0_4_ = auVar109._0_4_ * auVar125._0_4_;
      auVar107._4_4_ = auVar109._4_4_ * auVar125._4_4_;
      auVar107._8_4_ = auVar109._8_4_ * auVar125._8_4_;
      auVar107._12_4_ = auVar109._12_4_ * auVar125._12_4_;
      auVar107._16_4_ = auVar109._16_4_ * auVar125._16_4_;
      auVar107._20_4_ = auVar109._20_4_ * auVar125._20_4_;
      auVar107._24_4_ = auVar109._24_4_ * auVar125._24_4_;
      auVar107._28_4_ = 0;
      auVar18 = vfmsub231ps_fma(auVar107,local_660,auVar23);
      auVar18 = vfmadd231ps_fma(ZEXT1632(auVar17),ZEXT832(0) << 0x20,ZEXT1632(auVar18));
      auVar108._0_4_ = auVar24._0_4_ * auVar137._0_4_;
      auVar108._4_4_ = auVar24._4_4_ * auVar137._4_4_;
      auVar108._8_4_ = auVar24._8_4_ * auVar137._8_4_;
      auVar108._12_4_ = auVar24._12_4_ * auVar137._12_4_;
      auVar108._16_4_ = auVar24._16_4_ * auVar137._16_4_;
      auVar108._20_4_ = auVar24._20_4_ * auVar137._20_4_;
      auVar108._24_4_ = auVar24._24_4_ * auVar137._24_4_;
      auVar108._28_4_ = 0;
      auVar17 = vfmsub231ps_fma(auVar108,auVar105,auVar182);
      auVar121._0_4_ = auVar25._0_4_ * auVar182._0_4_;
      auVar121._4_4_ = auVar25._4_4_ * auVar182._4_4_;
      auVar121._8_4_ = auVar25._8_4_ * auVar182._8_4_;
      auVar121._12_4_ = auVar25._12_4_ * auVar182._12_4_;
      auVar121._16_4_ = auVar25._16_4_ * auVar182._16_4_;
      auVar121._20_4_ = auVar25._20_4_ * auVar182._20_4_;
      auVar121._24_4_ = auVar25._24_4_ * auVar182._24_4_;
      auVar121._28_4_ = 0;
      auVar19 = vfmsub231ps_fma(auVar121,auVar103,auVar24);
      auVar38._4_4_ = auVar105._4_4_ * auVar103._4_4_;
      auVar38._0_4_ = auVar105._0_4_ * auVar103._0_4_;
      auVar38._8_4_ = auVar105._8_4_ * auVar103._8_4_;
      auVar38._12_4_ = auVar105._12_4_ * auVar103._12_4_;
      auVar38._16_4_ = auVar105._16_4_ * auVar103._16_4_;
      auVar38._20_4_ = auVar105._20_4_ * auVar103._20_4_;
      auVar38._24_4_ = auVar105._24_4_ * auVar103._24_4_;
      auVar38._28_4_ = auVar103._28_4_;
      auVar20 = vfmsub231ps_fma(auVar38,auVar25,auVar137);
      auVar17 = vfmadd231ps_fma(ZEXT1632(auVar20),ZEXT832(0) << 0x20,ZEXT1632(auVar17));
      auVar19 = vfmadd231ps_fma(ZEXT1632(auVar17),ZEXT832(0) << 0x20,ZEXT1632(auVar19));
      auVar103 = vmaxps_avx(ZEXT1632(auVar18),ZEXT1632(auVar19));
      auVar103 = vcmpps_avx(auVar103,ZEXT832(0) << 0x20,2);
      auVar17 = vpackssdw_avx(auVar103._0_16_,auVar103._16_16_);
      auVar21 = vpand_avx(auVar17,auVar21);
      auVar103 = vpmovsxwd_avx2(auVar21);
      if ((((((((auVar103 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar103 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar103 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar103 >> 0x7f,0) == '\0') &&
            (auVar103 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar103 >> 0xbf,0) == '\0') &&
          (auVar103 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar103[0x1f]) {
LAB_011a1265:
        auVar146 = ZEXT3264(CONCAT824(uStack_468,
                                      CONCAT816(uStack_470,CONCAT88(uStack_478,local_480))));
        auVar187 = ZEXT3264(auVar186);
        auVar197 = ZEXT3264(auVar124);
      }
      else {
        local_760 = ZEXT1632(auVar21);
        auVar122._0_4_ = auVar109._0_4_ * auVar24._0_4_;
        auVar122._4_4_ = auVar109._4_4_ * auVar24._4_4_;
        auVar122._8_4_ = auVar109._8_4_ * auVar24._8_4_;
        auVar122._12_4_ = auVar109._12_4_ * auVar24._12_4_;
        auVar122._16_4_ = auVar109._16_4_ * auVar24._16_4_;
        auVar122._20_4_ = auVar109._20_4_ * auVar24._20_4_;
        auVar122._24_4_ = auVar109._24_4_ * auVar24._24_4_;
        auVar122._28_4_ = 0;
        auVar100 = vfmsub231ps_fma(auVar122,auVar25,auVar23);
        auVar39._4_4_ = auVar23._4_4_ * auVar105._4_4_;
        auVar39._0_4_ = auVar23._0_4_ * auVar105._0_4_;
        auVar39._8_4_ = auVar23._8_4_ * auVar105._8_4_;
        auVar39._12_4_ = auVar23._12_4_ * auVar105._12_4_;
        auVar39._16_4_ = auVar23._16_4_ * auVar105._16_4_;
        auVar39._20_4_ = auVar23._20_4_ * auVar105._20_4_;
        auVar39._24_4_ = auVar23._24_4_ * auVar105._24_4_;
        auVar39._28_4_ = auVar137._28_4_;
        auVar101 = vfmsub231ps_fma(auVar39,auVar22,auVar24);
        auVar40._4_4_ = auVar22._4_4_ * auVar25._4_4_;
        auVar40._0_4_ = auVar22._0_4_ * auVar25._0_4_;
        auVar40._8_4_ = auVar22._8_4_ * auVar25._8_4_;
        auVar40._12_4_ = auVar22._12_4_ * auVar25._12_4_;
        auVar40._16_4_ = auVar22._16_4_ * auVar25._16_4_;
        auVar40._20_4_ = auVar22._20_4_ * auVar25._20_4_;
        auVar40._24_4_ = auVar22._24_4_ * auVar25._24_4_;
        auVar40._28_4_ = auVar22._28_4_;
        auVar129 = vfmsub231ps_fma(auVar40,auVar105,auVar109);
        auVar17 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar101),ZEXT1632(auVar129));
        auVar20 = vfmadd231ps_fma(ZEXT1632(auVar17),ZEXT1632(auVar100),ZEXT832(0) << 0x20);
        auVar137 = vrcpps_avx(ZEXT1632(auVar20));
        auVar189._8_4_ = 0x3f800000;
        auVar189._0_8_ = 0x3f8000003f800000;
        auVar189._12_4_ = 0x3f800000;
        auVar189._16_4_ = 0x3f800000;
        auVar189._20_4_ = 0x3f800000;
        auVar189._24_4_ = 0x3f800000;
        auVar189._28_4_ = 0x3f800000;
        auVar17 = vfnmadd213ps_fma(auVar137,ZEXT1632(auVar20),auVar189);
        auVar17 = vfmadd132ps_fma(ZEXT1632(auVar17),auVar137,auVar137);
        auVar41._4_4_ = auVar129._4_4_ * auVar125._4_4_;
        auVar41._0_4_ = auVar129._0_4_ * auVar125._0_4_;
        auVar41._8_4_ = auVar129._8_4_ * auVar125._8_4_;
        auVar41._12_4_ = auVar129._12_4_ * auVar125._12_4_;
        auVar41._16_4_ = auVar125._16_4_ * 0.0;
        auVar41._20_4_ = auVar125._20_4_ * 0.0;
        auVar41._24_4_ = auVar125._24_4_ * 0.0;
        auVar41._28_4_ = auVar125._28_4_;
        auVar101 = vfmadd231ps_fma(auVar41,ZEXT1632(auVar101),local_660);
        auVar101 = vfmadd231ps_fma(ZEXT1632(auVar101),ZEXT1632(auVar100),_local_780);
        fVar110 = auVar17._0_4_;
        fVar111 = auVar17._4_4_;
        fVar112 = auVar17._8_4_;
        fVar113 = auVar17._12_4_;
        auVar42._28_4_ = auVar182._28_4_;
        auVar42._0_28_ =
             ZEXT1628(CONCAT412(fVar113 * auVar101._12_4_,
                                CONCAT48(fVar112 * auVar101._8_4_,
                                         CONCAT44(fVar111 * auVar101._4_4_,fVar110 * auVar101._0_4_)
                                        )));
        auVar123._8_8_ = local_520._0_8_;
        auVar123._0_8_ = local_520._0_8_;
        auVar123._16_8_ = local_520._0_8_;
        auVar123._24_8_ = local_520._0_8_;
        fVar128 = ray->tfar;
        auVar149._4_4_ = fVar128;
        auVar149._0_4_ = fVar128;
        auVar149._8_4_ = fVar128;
        auVar149._12_4_ = fVar128;
        auVar149._16_4_ = fVar128;
        auVar149._20_4_ = fVar128;
        auVar149._24_4_ = fVar128;
        auVar149._28_4_ = fVar128;
        auVar125 = vcmpps_avx(auVar123,auVar42,2);
        auVar137 = vcmpps_avx(auVar42,auVar149,2);
        auVar125 = vandps_avx(auVar137,auVar125);
        auVar17 = vpackssdw_avx(auVar125._0_16_,auVar125._16_16_);
        auVar21 = vpand_avx(auVar17,auVar21);
        auVar125 = vpmovsxwd_avx2(auVar21);
        if ((((((((auVar125 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar125 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar125 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar125 >> 0x7f,0) == '\0') &&
              (auVar125 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar125 >> 0xbf,0) == '\0') &&
            (auVar125 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar125[0x1f]) goto LAB_011a1265;
        auVar125 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT1632(auVar20),4);
        auVar17 = vpackssdw_avx(auVar125._0_16_,auVar125._16_16_);
        auVar21 = vpand_avx(auVar21,auVar17);
        auVar125 = vpmovsxwd_avx2(auVar21);
        auVar146 = ZEXT3264(CONCAT824(uStack_468,
                                      CONCAT816(uStack_470,CONCAT88(uStack_478,local_480))));
        auVar187 = ZEXT3264(auVar186);
        auVar197 = ZEXT3264(auVar124);
        if ((((((((auVar125 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar125 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar125 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar125 >> 0x7f,0) != '\0') ||
              (auVar125 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar125 >> 0xbf,0) != '\0') ||
            (auVar125 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar125[0x1f] < '\0') {
          auVar124 = ZEXT1632(CONCAT412(fVar113 * auVar18._12_4_,
                                        CONCAT48(fVar112 * auVar18._8_4_,
                                                 CONCAT44(fVar111 * auVar18._4_4_,
                                                          fVar110 * auVar18._0_4_))));
          auVar137 = ZEXT1632(CONCAT412(fVar113 * auVar19._12_4_,
                                        CONCAT48(fVar112 * auVar19._8_4_,
                                                 CONCAT44(fVar111 * auVar19._4_4_,
                                                          fVar110 * auVar19._0_4_))));
          auVar163._8_4_ = 0x3f800000;
          auVar163._0_8_ = 0x3f8000003f800000;
          auVar163._12_4_ = 0x3f800000;
          auVar163._16_4_ = 0x3f800000;
          auVar163._20_4_ = 0x3f800000;
          auVar163._24_4_ = 0x3f800000;
          auVar163._28_4_ = 0x3f800000;
          auVar186 = vsubps_avx(auVar163,auVar124);
          auVar186 = vblendvps_avx(auVar186,auVar124,auVar14);
          auVar187 = ZEXT3264(auVar186);
          auVar186 = vsubps_avx(auVar163,auVar137);
          local_380 = vblendvps_avx(auVar186,auVar137,auVar14);
          auVar146 = ZEXT3264(auVar125);
          auVar197 = ZEXT3264(auVar42);
        }
      }
      auVar203 = ZEXT3264(_local_540);
      auVar195 = ZEXT3264(local_6a0);
      auVar190 = ZEXT3264(local_680);
      auVar183 = ZEXT3264(local_6c0);
      auVar125 = auVar146._0_32_;
      auVar205 = ZEXT3264(local_5a0);
      if ((((((((auVar125 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar125 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar125 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar125 >> 0x7f,0) == '\0') &&
            (auVar146 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
           SUB321(auVar125 >> 0xbf,0) == '\0') &&
          (auVar146 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
          -1 < auVar146[0x1f]) goto LAB_011a00d1;
      auVar186 = vsubps_avx(local_400,local_3e0);
      local_280 = auVar187._0_32_;
      auVar21 = vfmadd213ps_fma(auVar186,local_280,local_3e0);
      fVar128 = local_708->depth_scale;
      auVar186._4_4_ = (auVar21._4_4_ + auVar21._4_4_) * fVar128;
      auVar186._0_4_ = (auVar21._0_4_ + auVar21._0_4_) * fVar128;
      auVar186._8_4_ = (auVar21._8_4_ + auVar21._8_4_) * fVar128;
      auVar186._12_4_ = (auVar21._12_4_ + auVar21._12_4_) * fVar128;
      auVar186._16_4_ = fVar128 * 0.0;
      auVar186._20_4_ = fVar128 * 0.0;
      auVar186._24_4_ = fVar128 * 0.0;
      auVar186._28_4_ = 0;
      local_240 = auVar197._0_32_;
      auVar186 = vcmpps_avx(local_240,auVar186,6);
      auVar124 = auVar125 & auVar186;
      auVar167 = ZEXT3264(CONCAT428(local_560,
                                    CONCAT424(local_560,
                                              CONCAT420(local_560,
                                                        CONCAT416(local_560,
                                                                  CONCAT412(local_560,
                                                                            CONCAT48(local_560,
                                                                                     CONCAT44(
                                                  local_560,local_560))))))));
      auVar171 = ZEXT3264(CONCAT428(fStack_57c,
                                    CONCAT424(local_580,
                                              CONCAT420(fStack_57c,
                                                        CONCAT416(local_580,
                                                                  CONCAT412(fStack_57c,
                                                                            CONCAT48(local_580,
                                                                                     auVar16._0_8_))
                                                                 )))));
      auVar174 = ZEXT3264(local_620);
      auVar146 = ZEXT3264(local_500);
      if ((((((((auVar124 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar124 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar124 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar124 >> 0x7f,0) == '\0') &&
            (auVar124 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar124 >> 0xbf,0) == '\0') &&
          (auVar124 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar124[0x1f]) {
LAB_011a019a:
        bVar94 = 0;
      }
      else {
        auVar124._8_4_ = 0xbf800000;
        auVar124._0_8_ = 0xbf800000bf800000;
        auVar124._12_4_ = 0xbf800000;
        auVar124._16_4_ = 0xbf800000;
        auVar124._20_4_ = 0xbf800000;
        auVar124._24_4_ = 0xbf800000;
        auVar124._28_4_ = 0xbf800000;
        auVar138._8_4_ = 0x40000000;
        auVar138._0_8_ = 0x4000000040000000;
        auVar138._12_4_ = 0x40000000;
        auVar138._16_4_ = 0x40000000;
        auVar138._20_4_ = 0x40000000;
        auVar138._24_4_ = 0x40000000;
        auVar138._28_4_ = 0x40000000;
        auVar21 = vfmadd213ps_fma(local_380,auVar138,auVar124);
        local_260 = ZEXT1632(auVar21);
        local_220 = 0;
        local_21c = iVar11;
        local_210 = *(undefined8 *)*pauVar1;
        uStack_208 = *(undefined8 *)(*pauVar1 + 8);
        local_200 = *(undefined8 *)*pauVar2;
        uStack_1f8 = *(undefined8 *)(*pauVar2 + 8);
        local_1f0 = *(undefined8 *)*pauVar3;
        uStack_1e8 = *(undefined8 *)(*pauVar3 + 8);
        local_380 = ZEXT1632(auVar21);
        auVar124 = local_380;
        if ((pGVar12->mask & ray->mask) == 0) {
          bVar94 = 0;
          auVar146 = ZEXT3264(local_500);
        }
        else {
          auVar146 = ZEXT3264(local_500);
          if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
             (bVar94 = 1, pGVar12->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
            auVar125 = vandps_avx(auVar186,auVar125);
            fVar128 = 1.0 / auVar119._0_4_;
            local_1a0[0] = fVar128 * (auVar187._0_4_ + 0.0);
            local_1a0[1] = fVar128 * (auVar187._4_4_ + 1.0);
            local_1a0[2] = fVar128 * (auVar187._8_4_ + 2.0);
            local_1a0[3] = fVar128 * (auVar187._12_4_ + 3.0);
            fStack_190 = fVar128 * (auVar187._16_4_ + 4.0);
            fStack_18c = fVar128 * (auVar187._20_4_ + 5.0);
            fStack_188 = fVar128 * (auVar187._24_4_ + 6.0);
            fStack_184 = auVar187._28_4_ + 7.0;
            local_380._0_8_ = auVar21._0_8_;
            local_380._8_8_ = auVar21._8_8_;
            local_180 = local_380._0_8_;
            uStack_178 = local_380._8_8_;
            uStack_170 = 0;
            uStack_168 = 0;
            local_160 = local_240;
            uVar95 = vmovmskps_avx(auVar125);
            lVar91 = 0;
            uVar92 = CONCAT44((int)((ulong)context->args >> 0x20),uVar95);
            for (uVar90 = uVar92; (uVar90 & 1) == 0; uVar90 = uVar90 >> 1 | 0x8000000000000000) {
              lVar91 = lVar91 + 1;
            }
            local_6e0 = local_280;
            local_700 = local_240;
            local_380 = auVar124;
            while (uVar92 != 0) {
              local_760._0_8_ = uVar92;
              local_4d4 = local_1a0[lVar91];
              local_4d0 = *(undefined4 *)((long)&local_180 + lVar91 * 4);
              local_660._0_4_ = ray->tfar;
              local_780 = (undefined1  [8])lVar91;
              ray->tfar = *(float *)(local_160 + lVar91 * 4);
              local_5d0.context = context->user;
              fVar110 = 1.0 - local_4d4;
              fVar128 = fVar110 * fVar110 * -3.0;
              auVar21 = vfmadd231ss_fma(ZEXT416((uint)(fVar110 * fVar110)),
                                        ZEXT416((uint)(local_4d4 * fVar110)),ZEXT416(0xc0000000));
              auVar16 = vfmsub132ss_fma(ZEXT416((uint)(local_4d4 * fVar110)),
                                        ZEXT416((uint)(local_4d4 * local_4d4)),ZEXT416(0x40000000));
              fVar110 = auVar21._0_4_ * 3.0;
              fVar111 = auVar16._0_4_ * 3.0;
              fVar112 = local_4d4 * local_4d4 * 3.0;
              auVar155._0_4_ = fVar112 * local_4a0;
              auVar155._4_4_ = fVar112 * fStack_49c;
              auVar155._8_4_ = fVar112 * fStack_498;
              auVar155._12_4_ = fVar112 * fStack_494;
              auVar131._4_4_ = fVar111;
              auVar131._0_4_ = fVar111;
              auVar131._8_4_ = fVar111;
              auVar131._12_4_ = fVar111;
              auVar77._8_8_ = uStack_5f8;
              auVar77._0_8_ = local_600;
              auVar21 = vfmadd132ps_fma(auVar131,auVar155,auVar77);
              auVar142._4_4_ = fVar110;
              auVar142._0_4_ = fVar110;
              auVar142._8_4_ = fVar110;
              auVar142._12_4_ = fVar110;
              auVar79._8_8_ = uStack_5e8;
              auVar79._0_8_ = local_5f0;
              auVar21 = vfmadd132ps_fma(auVar142,auVar21,auVar79);
              auVar132._4_4_ = fVar128;
              auVar132._0_4_ = fVar128;
              auVar132._8_4_ = fVar128;
              auVar132._12_4_ = fVar128;
              auVar81._8_8_ = uStack_5d8;
              auVar81._0_8_ = local_5e0;
              auVar21 = vfmadd132ps_fma(auVar132,auVar21,auVar81);
              local_4e0 = vmovlps_avx(auVar21);
              local_4d8 = vextractps_avx(auVar21,2);
              local_4cc = (int)local_4a8;
              local_4c8 = (int)local_710;
              local_4c4 = (local_5d0.context)->instID[0];
              local_4c0 = (local_5d0.context)->instPrimID[0];
              local_794 = -1;
              local_5d0.valid = &local_794;
              local_5d0.geometryUserPtr = pGVar12->userPtr;
              local_5d0.ray = (RTCRayN *)ray;
              local_5d0.hit = (RTCHitN *)&local_4e0;
              local_5d0.N = 1;
              if ((pGVar12->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                 ((*pGVar12->occlusionFilterN)(&local_5d0), *local_5d0.valid != 0)) {
                p_Var13 = context->args->filter;
                if ((p_Var13 == (RTCFilterFunctionN)0x0) ||
                   ((((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                      RTC_RAY_QUERY_FLAG_INCOHERENT && (((pGVar12->field_8).field_0x2 & 0x40) == 0))
                    || ((*p_Var13)(&local_5d0), *local_5d0.valid != 0)))) {
                  bVar94 = 1;
                  auVar190 = ZEXT3264(local_680);
                  auVar183 = ZEXT3264(local_6c0);
                  auVar187 = ZEXT3264(local_6e0);
                  auVar197 = ZEXT3264(local_700);
                  auVar195 = ZEXT3264(local_6a0);
                  auVar205 = ZEXT3264(local_5a0);
                  auVar167 = ZEXT3264(CONCAT428(fStack_544,
                                                CONCAT424(fStack_548,
                                                          CONCAT420(fStack_54c,
                                                                    CONCAT416(fStack_550,
                                                                              CONCAT412(fStack_554,
                                                                                        CONCAT48(
                                                  fStack_558,CONCAT44(fStack_55c,local_560))))))));
                  auVar171 = ZEXT3264(CONCAT428(fStack_564,
                                                CONCAT424(fStack_568,
                                                          CONCAT420(fStack_56c,
                                                                    CONCAT416(fStack_570,
                                                                              CONCAT412(fStack_574,
                                                                                        CONCAT48(
                                                  fStack_578,CONCAT44(fStack_57c,local_580))))))));
                  auVar174 = ZEXT3264(local_620);
                  auVar146 = ZEXT3264(local_500);
                  auVar203 = ZEXT3264(_local_540);
                  goto LAB_011a00f5;
                }
              }
              ray->tfar = (float)local_660._0_4_;
              lVar91 = 0;
              uVar92 = local_760._0_8_ ^ 1L << ((ulong)local_780 & 0x3f);
              for (uVar90 = uVar92; (uVar90 & 1) == 0; uVar90 = uVar90 >> 1 | 0x8000000000000000) {
                lVar91 = lVar91 + 1;
              }
              auVar190 = ZEXT3264(local_680);
              auVar183 = ZEXT3264(local_6c0);
              auVar187 = ZEXT3264(local_6e0);
              auVar197 = ZEXT3264(local_700);
              auVar195 = ZEXT3264(local_6a0);
              auVar205 = ZEXT3264(local_5a0);
              auVar167 = ZEXT3264(CONCAT428(fStack_544,
                                            CONCAT424(fStack_548,
                                                      CONCAT420(fStack_54c,
                                                                CONCAT416(fStack_550,
                                                                          CONCAT412(fStack_554,
                                                                                    CONCAT48(
                                                  fStack_558,CONCAT44(fStack_55c,local_560))))))));
              auVar171 = ZEXT3264(CONCAT428(fStack_564,
                                            CONCAT424(fStack_568,
                                                      CONCAT420(fStack_56c,
                                                                CONCAT416(fStack_570,
                                                                          CONCAT412(fStack_574,
                                                                                    CONCAT48(
                                                  fStack_578,CONCAT44(fStack_57c,local_580))))))));
              auVar174 = ZEXT3264(local_620);
              auVar146 = ZEXT3264(local_500);
              auVar203 = ZEXT3264(_local_540);
            }
            goto LAB_011a019a;
          }
        }
      }
    }
LAB_011a00f5:
    auVar127 = ZEXT3264(local_640);
    if (8 < iVar11) {
      local_340 = (float)iVar11;
      fStack_33c = (float)iVar11;
      fStack_338 = (float)iVar11;
      fStack_334 = (float)iVar11;
      fStack_330 = (float)iVar11;
      fStack_32c = (float)iVar11;
      fStack_328 = (float)iVar11;
      iStack_324 = iVar11;
      local_360._4_4_ = local_740._0_4_;
      local_360._0_4_ = local_740._0_4_;
      local_360._8_4_ = local_740._0_4_;
      local_360._12_4_ = local_740._0_4_;
      local_360._16_4_ = local_740._0_4_;
      local_360._20_4_ = local_740._0_4_;
      local_360._24_4_ = local_740._0_4_;
      local_360._28_4_ = local_740._0_4_;
      local_120 = local_520._0_8_;
      uStack_118 = local_520._0_8_;
      uStack_110 = local_520._0_8_;
      uStack_108 = local_520._0_8_;
      local_140 = 1.0 / (float)local_3c0._0_4_;
      fStack_13c = local_140;
      fStack_138 = local_140;
      fStack_134 = local_140;
      fStack_130 = local_140;
      fStack_12c = local_140;
      fStack_128 = local_140;
      fStack_124 = local_140;
      lVar91 = 8;
      local_6e0 = auVar187._0_32_;
      local_700 = auVar197._0_32_;
      _local_540 = auVar203._0_32_;
LAB_011a05d9:
      if (lVar91 < local_790) {
        auVar178 = auVar183._0_32_;
        auVar125 = *(undefined1 (*) [32])(bezier_basis0 + lVar91 * 4 + lVar93);
        local_740 = *(undefined1 (*) [32])(lVar93 + 0x21fb768 + lVar91 * 4);
        auVar186 = *(undefined1 (*) [32])(lVar93 + 0x21fbbec + lVar91 * 4);
        pauVar5 = (undefined1 (*) [28])(lVar93 + 0x21fc070 + lVar91 * 4);
        auVar87 = *pauVar5;
        auVar203._0_4_ = auVar167._0_4_ * *(float *)*pauVar5;
        auVar203._4_4_ = auVar167._4_4_ * *(float *)(*pauVar5 + 4);
        auVar203._8_4_ = auVar167._8_4_ * *(float *)(*pauVar5 + 8);
        auVar203._12_4_ = auVar167._12_4_ * *(float *)(*pauVar5 + 0xc);
        auVar203._16_4_ = auVar167._16_4_ * *(float *)(*pauVar5 + 0x10);
        auVar203._20_4_ = auVar167._20_4_ * *(float *)(*pauVar5 + 0x14);
        auVar203._28_36_ = auVar187._28_36_;
        auVar203._24_4_ = auVar167._24_4_ * *(float *)(*pauVar5 + 0x18);
        auVar43._4_4_ = auVar171._4_4_ * *(float *)(*pauVar5 + 4);
        auVar43._0_4_ = auVar171._0_4_ * *(float *)*pauVar5;
        auVar43._8_4_ = auVar171._8_4_ * *(float *)(*pauVar5 + 8);
        auVar43._12_4_ = auVar171._12_4_ * *(float *)(*pauVar5 + 0xc);
        auVar43._16_4_ = auVar171._16_4_ * *(float *)(*pauVar5 + 0x10);
        auVar43._20_4_ = auVar171._20_4_ * *(float *)(*pauVar5 + 0x14);
        auVar43._24_4_ = auVar171._24_4_ * *(float *)(*pauVar5 + 0x18);
        auVar43._28_4_ = *(undefined4 *)pauVar5[1];
        auVar182 = auVar195._0_32_;
        auVar21 = vfmadd231ps_fma(auVar203._0_32_,auVar186,auVar182);
        auVar16 = vfmadd231ps_fma(auVar43,auVar186,auVar205._0_32_);
        auVar21 = vfmadd231ps_fma(ZEXT1632(auVar21),local_740,auVar174._0_32_);
        auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),local_740,auVar127._0_32_);
        auVar21 = vfmadd231ps_fma(ZEXT1632(auVar21),auVar125,auVar146._0_32_);
        auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar125,local_460);
        auVar124 = *(undefined1 (*) [32])(bezier_basis1 + lVar91 * 4 + lVar93);
        auVar203 = ZEXT3264(auVar182);
        auVar137 = *(undefined1 (*) [32])(lVar93 + 0x21fdb88 + lVar91 * 4);
        auVar103 = *(undefined1 (*) [32])(lVar93 + 0x21fe00c + lVar91 * 4);
        pfVar6 = (float *)(lVar93 + 0x21fe490 + lVar91 * 4);
        fVar15 = *pfVar6;
        fVar198 = pfVar6[1];
        fVar204 = pfVar6[2];
        fVar72 = pfVar6[3];
        fVar73 = pfVar6[4];
        fVar74 = pfVar6[5];
        fVar75 = pfVar6[6];
        auVar195._0_4_ = fVar15 * auVar167._0_4_;
        auVar195._4_4_ = fVar198 * auVar167._4_4_;
        auVar195._8_4_ = fVar204 * auVar167._8_4_;
        auVar195._12_4_ = fVar72 * auVar167._12_4_;
        auVar195._16_4_ = fVar73 * auVar167._16_4_;
        auVar195._20_4_ = fVar74 * auVar167._20_4_;
        auVar195._28_36_ = auVar171._28_36_;
        auVar195._24_4_ = fVar75 * auVar167._24_4_;
        auVar197._0_4_ = fVar15 * auVar171._0_4_;
        auVar197._4_4_ = fVar198 * auVar171._4_4_;
        auVar197._8_4_ = fVar204 * auVar171._8_4_;
        auVar197._12_4_ = fVar72 * auVar171._12_4_;
        auVar197._16_4_ = fVar73 * auVar171._16_4_;
        auVar197._20_4_ = fVar74 * auVar171._20_4_;
        auVar197._28_36_ = auVar167._28_36_;
        auVar197._24_4_ = fVar75 * auVar171._24_4_;
        auVar17 = vfmadd231ps_fma(auVar195._0_32_,auVar103,auVar182);
        auVar18 = vfmadd231ps_fma(auVar197._0_32_,auVar103,auVar205._0_32_);
        auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar137,auVar174._0_32_);
        auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar137,auVar127._0_32_);
        auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar124,auVar146._0_32_);
        auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar124,local_460);
        local_300 = ZEXT1632(auVar17);
        _local_420 = ZEXT1632(auVar21);
        local_2e0 = vsubps_avx(local_300,_local_420);
        local_400 = ZEXT1632(auVar18);
        local_3e0 = ZEXT1632(auVar16);
        local_320 = vsubps_avx(local_400,local_3e0);
        auVar44._4_4_ = auVar16._4_4_ * local_2e0._4_4_;
        auVar44._0_4_ = auVar16._0_4_ * local_2e0._0_4_;
        auVar44._8_4_ = auVar16._8_4_ * local_2e0._8_4_;
        auVar44._12_4_ = auVar16._12_4_ * local_2e0._12_4_;
        auVar44._16_4_ = local_2e0._16_4_ * 0.0;
        auVar44._20_4_ = local_2e0._20_4_ * 0.0;
        auVar44._24_4_ = local_2e0._24_4_ * 0.0;
        auVar44._28_4_ = auVar171._28_4_;
        fVar128 = local_320._0_4_;
        auVar187._0_4_ = auVar21._0_4_ * fVar128;
        fVar110 = local_320._4_4_;
        auVar187._4_4_ = auVar21._4_4_ * fVar110;
        fVar111 = local_320._8_4_;
        auVar187._8_4_ = auVar21._8_4_ * fVar111;
        fVar112 = local_320._12_4_;
        auVar187._12_4_ = auVar21._12_4_ * fVar112;
        fVar113 = local_320._16_4_;
        auVar187._16_4_ = fVar113 * 0.0;
        fVar114 = local_320._20_4_;
        auVar187._20_4_ = fVar114 * 0.0;
        fVar115 = local_320._24_4_;
        auVar187._28_36_ = auVar127._28_36_;
        auVar187._24_4_ = fVar115 * 0.0;
        auVar136 = vsubps_avx(auVar44,auVar187._0_32_);
        local_780._0_4_ = auVar87._0_4_;
        local_780._4_4_ = auVar87._4_4_;
        auStack_778._0_4_ = auVar87._8_4_;
        auStack_778._4_4_ = auVar87._12_4_;
        fStack_770 = auVar87._16_4_;
        fStack_76c = auVar87._20_4_;
        fStack_768 = auVar87._24_4_;
        auVar164._0_4_ = (float)local_e0 * (float)local_780._0_4_;
        auVar164._4_4_ = local_e0._4_4_ * (float)local_780._4_4_;
        auVar164._8_4_ = (float)uStack_d8 * (float)auStack_778._0_4_;
        auVar164._12_4_ = uStack_d8._4_4_ * (float)auStack_778._4_4_;
        auVar164._16_4_ = (float)uStack_d0 * fStack_770;
        auVar164._20_4_ = uStack_d0._4_4_ * fStack_76c;
        auVar164._24_4_ = (float)uStack_c8 * fStack_768;
        auVar164._28_4_ = 0;
        auVar21 = vfmadd231ps_fma(auVar164,auVar186,local_c0);
        auVar21 = vfmadd231ps_fma(ZEXT1632(auVar21),local_a0,local_740);
        auVar21 = vfmadd231ps_fma(ZEXT1632(auVar21),local_80,auVar125);
        auVar45._4_4_ = fVar198 * local_e0._4_4_;
        auVar45._0_4_ = fVar15 * (float)local_e0;
        auVar45._8_4_ = fVar204 * (float)uStack_d8;
        auVar45._12_4_ = fVar72 * uStack_d8._4_4_;
        auVar45._16_4_ = fVar73 * (float)uStack_d0;
        auVar45._20_4_ = fVar74 * uStack_d0._4_4_;
        auVar45._24_4_ = fVar75 * (float)uStack_c8;
        auVar45._28_4_ = uStack_c8._4_4_;
        auVar16 = vfmadd231ps_fma(auVar45,auVar103,local_c0);
        auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar137,local_a0);
        auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar124,local_80);
        auVar46._4_4_ = fVar110 * fVar110;
        auVar46._0_4_ = fVar128 * fVar128;
        auVar46._8_4_ = fVar111 * fVar111;
        auVar46._12_4_ = fVar112 * fVar112;
        auVar46._16_4_ = fVar113 * fVar113;
        auVar46._20_4_ = fVar114 * fVar114;
        auVar46._24_4_ = fVar115 * fVar115;
        auVar46._28_4_ = local_80._28_4_;
        auVar17 = vfmadd231ps_fma(auVar46,local_2e0,local_2e0);
        auVar182 = vmaxps_avx(ZEXT1632(auVar21),ZEXT1632(auVar16));
        auVar179._0_4_ = auVar182._0_4_ * auVar182._0_4_ * auVar17._0_4_;
        auVar179._4_4_ = auVar182._4_4_ * auVar182._4_4_ * auVar17._4_4_;
        auVar179._8_4_ = auVar182._8_4_ * auVar182._8_4_ * auVar17._8_4_;
        auVar179._12_4_ = auVar182._12_4_ * auVar182._12_4_ * auVar17._12_4_;
        auVar179._16_4_ = auVar182._16_4_ * auVar182._16_4_ * 0.0;
        auVar179._20_4_ = auVar182._20_4_ * auVar182._20_4_ * 0.0;
        auVar179._24_4_ = auVar182._24_4_ * auVar182._24_4_ * 0.0;
        auVar179._28_4_ = 0;
        auVar47._4_4_ = auVar136._4_4_ * auVar136._4_4_;
        auVar47._0_4_ = auVar136._0_4_ * auVar136._0_4_;
        auVar47._8_4_ = auVar136._8_4_ * auVar136._8_4_;
        auVar47._12_4_ = auVar136._12_4_ * auVar136._12_4_;
        auVar47._16_4_ = auVar136._16_4_ * auVar136._16_4_;
        auVar47._20_4_ = auVar136._20_4_ * auVar136._20_4_;
        auVar47._24_4_ = auVar136._24_4_ * auVar136._24_4_;
        auVar47._28_4_ = auVar136._28_4_;
        auVar182 = vcmpps_avx(auVar47,auVar179,2);
        local_220 = (int)lVar91;
        auVar180._4_4_ = local_220;
        auVar180._0_4_ = local_220;
        auVar180._8_4_ = local_220;
        auVar180._12_4_ = local_220;
        auVar180._16_4_ = local_220;
        auVar180._20_4_ = local_220;
        auVar180._24_4_ = local_220;
        auVar180._28_4_ = local_220;
        auVar136 = vpor_avx2(auVar180,_DAT_01fb4ba0);
        auVar85._4_4_ = fStack_33c;
        auVar85._0_4_ = local_340;
        auVar85._8_4_ = fStack_338;
        auVar85._12_4_ = fStack_334;
        auVar85._16_4_ = fStack_330;
        auVar85._20_4_ = fStack_32c;
        auVar85._24_4_ = fStack_328;
        auVar85._28_4_ = iStack_324;
        auVar109 = vpcmpgtd_avx2(auVar85,auVar136);
        auVar136 = auVar109 & auVar182;
        if ((((((((auVar136 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar136 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar136 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar136 >> 0x7f,0) != '\0') ||
              (auVar136 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar136 >> 0xbf,0) != '\0') ||
            (auVar136 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar136[0x1f] < '\0') {
          local_3c0 = vandps_avx(auVar109,auVar182);
          auVar48._4_4_ = fVar198 * (float)local_540._4_4_;
          auVar48._0_4_ = fVar15 * (float)local_540._0_4_;
          auVar48._8_4_ = fVar204 * fStack_538;
          auVar48._12_4_ = fVar72 * fStack_534;
          auVar48._16_4_ = fVar73 * fStack_530;
          auVar48._20_4_ = fVar74 * fStack_52c;
          auVar48._24_4_ = fVar75 * fStack_528;
          auVar48._28_4_ = auVar182._28_4_;
          auVar17 = vfmadd213ps_fma(auVar103,local_2c0,auVar48);
          auVar17 = vfmadd213ps_fma(auVar137,local_100,ZEXT1632(auVar17));
          auVar17 = vfmadd132ps_fma(auVar124,ZEXT1632(auVar17),local_440);
          auVar49._4_4_ = (float)local_540._4_4_ * (float)local_780._4_4_;
          auVar49._0_4_ = (float)local_540._0_4_ * (float)local_780._0_4_;
          auVar49._8_4_ = fStack_538 * (float)auStack_778._0_4_;
          auVar49._12_4_ = fStack_534 * (float)auStack_778._4_4_;
          auVar49._16_4_ = fStack_530 * fStack_770;
          auVar49._20_4_ = fStack_52c * fStack_76c;
          auVar49._24_4_ = fStack_528 * fStack_768;
          auVar49._28_4_ = auVar182._28_4_;
          auVar18 = vfmadd213ps_fma(auVar186,local_2c0,auVar49);
          auVar18 = vfmadd213ps_fma(local_740,local_100,ZEXT1632(auVar18));
          auVar186 = *(undefined1 (*) [32])(lVar93 + 0x21fc4f4 + lVar91 * 4);
          auVar124 = *(undefined1 (*) [32])(lVar93 + 0x21fc978 + lVar91 * 4);
          auVar137 = *(undefined1 (*) [32])(lVar93 + 0x21fcdfc + lVar91 * 4);
          pfVar6 = (float *)(lVar93 + 0x21fd280 + lVar91 * 4);
          fVar128 = *pfVar6;
          fVar110 = pfVar6[1];
          fVar111 = pfVar6[2];
          fVar112 = pfVar6[3];
          fVar113 = pfVar6[4];
          fVar114 = pfVar6[5];
          fVar115 = pfVar6[6];
          auVar172._0_4_ = local_560 * fVar128;
          auVar172._4_4_ = fStack_55c * fVar110;
          auVar172._8_4_ = fStack_558 * fVar111;
          auVar172._12_4_ = fStack_554 * fVar112;
          auVar172._16_4_ = fStack_550 * fVar113;
          auVar172._20_4_ = fStack_54c * fVar114;
          auVar172._24_4_ = fStack_548 * fVar115;
          auVar172._28_4_ = 0;
          auVar193._0_4_ = local_580 * fVar128;
          auVar193._4_4_ = fStack_57c * fVar110;
          auVar193._8_4_ = fStack_578 * fVar111;
          auVar193._12_4_ = fStack_574 * fVar112;
          auVar193._16_4_ = fStack_570 * fVar113;
          auVar193._20_4_ = fStack_56c * fVar114;
          auVar193._24_4_ = fStack_568 * fVar115;
          auVar193._28_4_ = 0;
          auVar50._4_4_ = fVar110 * (float)local_540._4_4_;
          auVar50._0_4_ = fVar128 * (float)local_540._0_4_;
          auVar50._8_4_ = fVar111 * fStack_538;
          auVar50._12_4_ = fVar112 * fStack_534;
          auVar50._16_4_ = fVar113 * fStack_530;
          auVar50._20_4_ = fVar114 * fStack_52c;
          auVar50._24_4_ = fVar115 * fStack_528;
          auVar50._28_4_ = pfVar6[7];
          auVar19 = vfmadd231ps_fma(auVar172,auVar137,local_6a0);
          auVar20 = vfmadd231ps_fma(auVar193,auVar137,local_5a0);
          auVar101 = vfmadd231ps_fma(auVar50,local_2c0,auVar137);
          auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar124,local_620);
          auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar124,local_640);
          auVar101 = vfmadd231ps_fma(ZEXT1632(auVar101),local_100,auVar124);
          auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar186,local_500);
          auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar186,local_460);
          auVar101 = vfmadd231ps_fma(ZEXT1632(auVar101),auVar186,local_440);
          pfVar6 = (float *)(lVar93 + 0x21ff6a0 + lVar91 * 4);
          fVar128 = *pfVar6;
          fVar110 = pfVar6[1];
          fVar111 = pfVar6[2];
          fVar112 = pfVar6[3];
          fVar113 = pfVar6[4];
          fVar114 = pfVar6[5];
          fVar115 = pfVar6[6];
          auVar51._4_4_ = fStack_55c * fVar110;
          auVar51._0_4_ = local_560 * fVar128;
          auVar51._8_4_ = fStack_558 * fVar111;
          auVar51._12_4_ = fStack_554 * fVar112;
          auVar51._16_4_ = fStack_550 * fVar113;
          auVar51._20_4_ = fStack_54c * fVar114;
          auVar51._24_4_ = fStack_548 * fVar115;
          auVar51._28_4_ = fStack_544;
          auVar52._4_4_ = fStack_57c * fVar110;
          auVar52._0_4_ = local_580 * fVar128;
          auVar52._8_4_ = fStack_578 * fVar111;
          auVar52._12_4_ = fStack_574 * fVar112;
          auVar52._16_4_ = fStack_570 * fVar113;
          auVar52._20_4_ = fStack_56c * fVar114;
          auVar52._24_4_ = fStack_568 * fVar115;
          auVar52._28_4_ = fStack_564;
          auVar53._4_4_ = fVar110 * (float)local_540._4_4_;
          auVar53._0_4_ = fVar128 * (float)local_540._0_4_;
          auVar53._8_4_ = fVar111 * fStack_538;
          auVar53._12_4_ = fVar112 * fStack_534;
          auVar53._16_4_ = fVar113 * fStack_530;
          auVar53._20_4_ = fVar114 * fStack_52c;
          auVar53._24_4_ = fVar115 * fStack_528;
          auVar53._28_4_ = pfVar6[7];
          auVar186 = *(undefined1 (*) [32])(lVar93 + 0x21ff21c + lVar91 * 4);
          auVar100 = vfmadd231ps_fma(auVar51,auVar186,local_6a0);
          auVar129 = vfmadd231ps_fma(auVar52,auVar186,local_5a0);
          auVar117 = vfmadd231ps_fma(auVar53,local_2c0,auVar186);
          auVar186 = *(undefined1 (*) [32])(lVar93 + 0x21fed98 + lVar91 * 4);
          auVar100 = vfmadd231ps_fma(ZEXT1632(auVar100),auVar186,local_620);
          auVar129 = vfmadd231ps_fma(ZEXT1632(auVar129),auVar186,local_640);
          auVar117 = vfmadd231ps_fma(ZEXT1632(auVar117),local_100,auVar186);
          auVar186 = *(undefined1 (*) [32])(lVar93 + 0x21fe914 + lVar91 * 4);
          auVar100 = vfmadd231ps_fma(ZEXT1632(auVar100),auVar186,local_500);
          auVar129 = vfmadd231ps_fma(ZEXT1632(auVar129),auVar186,local_460);
          auVar117 = vfmadd231ps_fma(ZEXT1632(auVar117),local_440,auVar186);
          auVar181._8_4_ = 0x7fffffff;
          auVar181._0_8_ = 0x7fffffff7fffffff;
          auVar181._12_4_ = 0x7fffffff;
          auVar181._16_4_ = 0x7fffffff;
          auVar181._20_4_ = 0x7fffffff;
          auVar181._24_4_ = 0x7fffffff;
          auVar181._28_4_ = 0x7fffffff;
          auVar186 = vandps_avx(ZEXT1632(auVar19),auVar181);
          auVar124 = vandps_avx(ZEXT1632(auVar20),auVar181);
          auVar124 = vmaxps_avx(auVar186,auVar124);
          auVar186 = vandps_avx(ZEXT1632(auVar101),auVar181);
          auVar186 = vmaxps_avx(auVar124,auVar186);
          auVar186 = vcmpps_avx(auVar186,local_360,1);
          auVar137 = vblendvps_avx(ZEXT1632(auVar19),local_2e0,auVar186);
          auVar103 = vblendvps_avx(ZEXT1632(auVar20),local_320,auVar186);
          auVar186 = vandps_avx(ZEXT1632(auVar100),auVar181);
          auVar124 = vandps_avx(ZEXT1632(auVar129),auVar181);
          auVar124 = vmaxps_avx(auVar186,auVar124);
          auVar186 = vandps_avx(auVar181,ZEXT1632(auVar117));
          auVar186 = vmaxps_avx(auVar124,auVar186);
          auVar124 = vcmpps_avx(auVar186,local_360,1);
          auVar186 = vblendvps_avx(ZEXT1632(auVar100),local_2e0,auVar124);
          auVar124 = vblendvps_avx(ZEXT1632(auVar129),local_320,auVar124);
          auVar18 = vfmadd213ps_fma(auVar125,local_440,ZEXT1632(auVar18));
          auVar19 = vfmadd213ps_fma(auVar137,auVar137,ZEXT832(0) << 0x20);
          auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar103,auVar103);
          auVar125 = vrsqrtps_avx(ZEXT1632(auVar19));
          fVar128 = auVar125._0_4_;
          fVar110 = auVar125._4_4_;
          fVar111 = auVar125._8_4_;
          fVar112 = auVar125._12_4_;
          fVar113 = auVar125._16_4_;
          fVar114 = auVar125._20_4_;
          fVar115 = auVar125._24_4_;
          auVar54._4_4_ = fVar110 * fVar110 * fVar110 * auVar19._4_4_ * -0.5;
          auVar54._0_4_ = fVar128 * fVar128 * fVar128 * auVar19._0_4_ * -0.5;
          auVar54._8_4_ = fVar111 * fVar111 * fVar111 * auVar19._8_4_ * -0.5;
          auVar54._12_4_ = fVar112 * fVar112 * fVar112 * auVar19._12_4_ * -0.5;
          auVar54._16_4_ = fVar113 * fVar113 * fVar113 * -0.0;
          auVar54._20_4_ = fVar114 * fVar114 * fVar114 * -0.0;
          auVar54._24_4_ = fVar115 * fVar115 * fVar115 * -0.0;
          auVar54._28_4_ = 0;
          auVar202._8_4_ = 0x3fc00000;
          auVar202._0_8_ = 0x3fc000003fc00000;
          auVar202._12_4_ = 0x3fc00000;
          auVar202._16_4_ = 0x3fc00000;
          auVar202._20_4_ = 0x3fc00000;
          auVar202._24_4_ = 0x3fc00000;
          auVar202._28_4_ = 0x3fc00000;
          auVar19 = vfmadd231ps_fma(auVar54,auVar202,auVar125);
          fVar128 = auVar19._0_4_;
          fVar110 = auVar19._4_4_;
          auVar55._4_4_ = auVar103._4_4_ * fVar110;
          auVar55._0_4_ = auVar103._0_4_ * fVar128;
          fVar111 = auVar19._8_4_;
          auVar55._8_4_ = auVar103._8_4_ * fVar111;
          fVar112 = auVar19._12_4_;
          auVar55._12_4_ = auVar103._12_4_ * fVar112;
          auVar55._16_4_ = auVar103._16_4_ * 0.0;
          auVar55._20_4_ = auVar103._20_4_ * 0.0;
          auVar55._24_4_ = auVar103._24_4_ * 0.0;
          auVar55._28_4_ = auVar125._28_4_;
          auVar56._4_4_ = fVar110 * -auVar137._4_4_;
          auVar56._0_4_ = fVar128 * -auVar137._0_4_;
          auVar56._8_4_ = fVar111 * -auVar137._8_4_;
          auVar56._12_4_ = fVar112 * -auVar137._12_4_;
          auVar56._16_4_ = -auVar137._16_4_ * 0.0;
          auVar56._20_4_ = -auVar137._20_4_ * 0.0;
          auVar56._24_4_ = -auVar137._24_4_ * 0.0;
          auVar56._28_4_ = auVar103._28_4_;
          auVar19 = vfmadd213ps_fma(auVar186,auVar186,ZEXT832(0) << 0x20);
          auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar124,auVar124);
          auVar125 = vrsqrtps_avx(ZEXT1632(auVar19));
          auVar57._28_4_ = local_320._28_4_;
          auVar57._0_28_ =
               ZEXT1628(CONCAT412(fVar112 * 0.0,
                                  CONCAT48(fVar111 * 0.0,CONCAT44(fVar110 * 0.0,fVar128 * 0.0))));
          fVar128 = auVar125._0_4_;
          fVar110 = auVar125._4_4_;
          fVar111 = auVar125._8_4_;
          fVar112 = auVar125._12_4_;
          fVar113 = auVar125._16_4_;
          fVar114 = auVar125._20_4_;
          fVar115 = auVar125._24_4_;
          auVar58._4_4_ = fVar110 * fVar110 * fVar110 * auVar19._4_4_ * -0.5;
          auVar58._0_4_ = fVar128 * fVar128 * fVar128 * auVar19._0_4_ * -0.5;
          auVar58._8_4_ = fVar111 * fVar111 * fVar111 * auVar19._8_4_ * -0.5;
          auVar58._12_4_ = fVar112 * fVar112 * fVar112 * auVar19._12_4_ * -0.5;
          auVar58._16_4_ = fVar113 * fVar113 * fVar113 * -0.0;
          auVar58._20_4_ = fVar114 * fVar114 * fVar114 * -0.0;
          auVar58._24_4_ = fVar115 * fVar115 * fVar115 * -0.0;
          auVar58._28_4_ = 0;
          auVar19 = vfmadd231ps_fma(auVar58,auVar202,auVar125);
          fVar128 = auVar19._0_4_;
          fVar110 = auVar19._4_4_;
          auVar59._4_4_ = auVar124._4_4_ * fVar110;
          auVar59._0_4_ = auVar124._0_4_ * fVar128;
          fVar111 = auVar19._8_4_;
          auVar59._8_4_ = auVar124._8_4_ * fVar111;
          fVar112 = auVar19._12_4_;
          auVar59._12_4_ = auVar124._12_4_ * fVar112;
          auVar59._16_4_ = auVar124._16_4_ * 0.0;
          auVar59._20_4_ = auVar124._20_4_ * 0.0;
          auVar59._24_4_ = auVar124._24_4_ * 0.0;
          auVar59._28_4_ = 0;
          auVar60._4_4_ = fVar110 * -auVar186._4_4_;
          auVar60._0_4_ = fVar128 * -auVar186._0_4_;
          auVar60._8_4_ = fVar111 * -auVar186._8_4_;
          auVar60._12_4_ = fVar112 * -auVar186._12_4_;
          auVar60._16_4_ = -auVar186._16_4_ * 0.0;
          auVar60._20_4_ = -auVar186._20_4_ * 0.0;
          auVar60._24_4_ = -auVar186._24_4_ * 0.0;
          auVar60._28_4_ = auVar125._28_4_;
          auVar61._28_4_ = 0xbf000000;
          auVar61._0_28_ =
               ZEXT1628(CONCAT412(fVar112 * 0.0,
                                  CONCAT48(fVar111 * 0.0,CONCAT44(fVar110 * 0.0,fVar128 * 0.0))));
          auVar19 = vfmadd213ps_fma(auVar55,ZEXT1632(auVar21),_local_420);
          auVar125 = ZEXT1632(auVar21);
          auVar20 = vfmadd213ps_fma(auVar56,auVar125,local_3e0);
          auVar101 = vfmadd213ps_fma(auVar57,auVar125,ZEXT1632(auVar18));
          auVar117 = vfnmadd213ps_fma(auVar55,auVar125,_local_420);
          auVar100 = vfmadd213ps_fma(auVar59,ZEXT1632(auVar16),local_300);
          auVar99 = vfnmadd213ps_fma(auVar56,auVar125,local_3e0);
          auVar125 = ZEXT1632(auVar16);
          auVar129 = vfmadd213ps_fma(auVar60,auVar125,local_400);
          local_740 = ZEXT1632(auVar21);
          auVar21 = vfnmadd231ps_fma(ZEXT1632(auVar18),local_740,auVar57);
          auVar18 = vfmadd213ps_fma(auVar61,auVar125,ZEXT1632(auVar17));
          auVar130 = vfnmadd213ps_fma(auVar59,auVar125,local_300);
          auVar140 = vfnmadd213ps_fma(auVar60,auVar125,local_400);
          auVar148 = vfnmadd231ps_fma(ZEXT1632(auVar17),ZEXT1632(auVar16),auVar61);
          local_520 = ZEXT1632(auVar148);
          auVar125 = vsubps_avx(ZEXT1632(auVar129),ZEXT1632(auVar99));
          auVar186 = vsubps_avx(ZEXT1632(auVar18),ZEXT1632(auVar21));
          auVar165._0_4_ = auVar125._0_4_ * auVar21._0_4_;
          auVar165._4_4_ = auVar125._4_4_ * auVar21._4_4_;
          auVar165._8_4_ = auVar125._8_4_ * auVar21._8_4_;
          auVar165._12_4_ = auVar125._12_4_ * auVar21._12_4_;
          auVar165._16_4_ = auVar125._16_4_ * 0.0;
          auVar165._20_4_ = auVar125._20_4_ * 0.0;
          auVar165._24_4_ = auVar125._24_4_ * 0.0;
          auVar165._28_4_ = 0;
          auVar17 = vfmsub231ps_fma(auVar165,ZEXT1632(auVar99),auVar186);
          auVar62._4_4_ = auVar117._4_4_ * auVar186._4_4_;
          auVar62._0_4_ = auVar117._0_4_ * auVar186._0_4_;
          auVar62._8_4_ = auVar117._8_4_ * auVar186._8_4_;
          auVar62._12_4_ = auVar117._12_4_ * auVar186._12_4_;
          auVar62._16_4_ = auVar186._16_4_ * 0.0;
          auVar62._20_4_ = auVar186._20_4_ * 0.0;
          auVar62._24_4_ = auVar186._24_4_ * 0.0;
          auVar62._28_4_ = auVar186._28_4_;
          auVar182 = ZEXT1632(auVar117);
          auVar186 = vsubps_avx(ZEXT1632(auVar100),auVar182);
          auVar109 = ZEXT1632(auVar21);
          auVar21 = vfmsub231ps_fma(auVar62,auVar109,auVar186);
          auVar63._4_4_ = auVar99._4_4_ * auVar186._4_4_;
          auVar63._0_4_ = auVar99._0_4_ * auVar186._0_4_;
          auVar63._8_4_ = auVar99._8_4_ * auVar186._8_4_;
          auVar63._12_4_ = auVar99._12_4_ * auVar186._12_4_;
          auVar63._16_4_ = auVar186._16_4_ * 0.0;
          auVar63._20_4_ = auVar186._20_4_ * 0.0;
          auVar63._24_4_ = auVar186._24_4_ * 0.0;
          auVar63._28_4_ = auVar186._28_4_;
          auVar117 = vfmsub231ps_fma(auVar63,auVar182,auVar125);
          auVar21 = vfmadd231ps_fma(ZEXT1632(auVar117),ZEXT832(0) << 0x20,ZEXT1632(auVar21));
          auVar21 = vfmadd231ps_fma(ZEXT1632(auVar21),ZEXT832(0) << 0x20,ZEXT1632(auVar17));
          auVar14 = vcmpps_avx(ZEXT1632(auVar21),ZEXT832(0) << 0x20,2);
          auVar125 = vblendvps_avx(ZEXT1632(auVar130),ZEXT1632(auVar19),auVar14);
          local_660 = vblendvps_avx(ZEXT1632(auVar140),ZEXT1632(auVar20),auVar14);
          auVar186 = vblendvps_avx(local_520,ZEXT1632(auVar101),auVar14);
          auVar124 = vblendvps_avx(auVar182,ZEXT1632(auVar100),auVar14);
          auVar137 = vblendvps_avx(ZEXT1632(auVar99),ZEXT1632(auVar129),auVar14);
          auVar103 = vblendvps_avx(auVar109,ZEXT1632(auVar18),auVar14);
          auVar182 = vblendvps_avx(ZEXT1632(auVar100),auVar182,auVar14);
          auVar136 = vblendvps_avx(ZEXT1632(auVar129),ZEXT1632(auVar99),auVar14);
          auVar21 = vpackssdw_avx(local_3c0._0_16_,local_3c0._16_16_);
          local_760 = ZEXT1632(auVar21);
          auVar109 = vblendvps_avx(ZEXT1632(auVar18),auVar109,auVar14);
          auVar182 = vsubps_avx(auVar182,auVar125);
          auVar136 = vsubps_avx(auVar136,local_660);
          auVar22 = vsubps_avx(auVar109,auVar186);
          auVar23 = vsubps_avx(auVar125,auVar124);
          auVar105 = vsubps_avx(local_660,auVar137);
          auVar25 = vsubps_avx(auVar186,auVar103);
          auVar157._0_4_ = auVar22._0_4_ * auVar125._0_4_;
          auVar157._4_4_ = auVar22._4_4_ * auVar125._4_4_;
          auVar157._8_4_ = auVar22._8_4_ * auVar125._8_4_;
          auVar157._12_4_ = auVar22._12_4_ * auVar125._12_4_;
          auVar157._16_4_ = auVar22._16_4_ * auVar125._16_4_;
          auVar157._20_4_ = auVar22._20_4_ * auVar125._20_4_;
          auVar157._24_4_ = auVar22._24_4_ * auVar125._24_4_;
          auVar157._28_4_ = 0;
          auVar17 = vfmsub231ps_fma(auVar157,auVar186,auVar182);
          auVar64._4_4_ = auVar182._4_4_ * local_660._4_4_;
          auVar64._0_4_ = auVar182._0_4_ * local_660._0_4_;
          auVar64._8_4_ = auVar182._8_4_ * local_660._8_4_;
          auVar64._12_4_ = auVar182._12_4_ * local_660._12_4_;
          auVar64._16_4_ = auVar182._16_4_ * local_660._16_4_;
          auVar64._20_4_ = auVar182._20_4_ * local_660._20_4_;
          auVar64._24_4_ = auVar182._24_4_ * local_660._24_4_;
          auVar64._28_4_ = auVar109._28_4_;
          auVar18 = vfmsub231ps_fma(auVar64,auVar125,auVar136);
          auVar17 = vfmadd231ps_fma(ZEXT1632(auVar18),ZEXT832(0) << 0x20,ZEXT1632(auVar17));
          auVar158._0_4_ = auVar136._0_4_ * auVar186._0_4_;
          auVar158._4_4_ = auVar136._4_4_ * auVar186._4_4_;
          auVar158._8_4_ = auVar136._8_4_ * auVar186._8_4_;
          auVar158._12_4_ = auVar136._12_4_ * auVar186._12_4_;
          auVar158._16_4_ = auVar136._16_4_ * auVar186._16_4_;
          auVar158._20_4_ = auVar136._20_4_ * auVar186._20_4_;
          auVar158._24_4_ = auVar136._24_4_ * auVar186._24_4_;
          auVar158._28_4_ = 0;
          auVar18 = vfmsub231ps_fma(auVar158,local_660,auVar22);
          auVar18 = vfmadd231ps_fma(ZEXT1632(auVar17),ZEXT832(0) << 0x20,ZEXT1632(auVar18));
          auVar159._0_4_ = auVar25._0_4_ * auVar124._0_4_;
          auVar159._4_4_ = auVar25._4_4_ * auVar124._4_4_;
          auVar159._8_4_ = auVar25._8_4_ * auVar124._8_4_;
          auVar159._12_4_ = auVar25._12_4_ * auVar124._12_4_;
          auVar159._16_4_ = auVar25._16_4_ * auVar124._16_4_;
          auVar159._20_4_ = auVar25._20_4_ * auVar124._20_4_;
          auVar159._24_4_ = auVar25._24_4_ * auVar124._24_4_;
          auVar159._28_4_ = 0;
          auVar17 = vfmsub231ps_fma(auVar159,auVar23,auVar103);
          auVar65._4_4_ = auVar105._4_4_ * auVar103._4_4_;
          auVar65._0_4_ = auVar105._0_4_ * auVar103._0_4_;
          auVar65._8_4_ = auVar105._8_4_ * auVar103._8_4_;
          auVar65._12_4_ = auVar105._12_4_ * auVar103._12_4_;
          auVar65._16_4_ = auVar105._16_4_ * auVar103._16_4_;
          auVar65._20_4_ = auVar105._20_4_ * auVar103._20_4_;
          auVar65._24_4_ = auVar105._24_4_ * auVar103._24_4_;
          auVar65._28_4_ = auVar103._28_4_;
          auVar19 = vfmsub231ps_fma(auVar65,auVar137,auVar25);
          auVar66._4_4_ = auVar23._4_4_ * auVar137._4_4_;
          auVar66._0_4_ = auVar23._0_4_ * auVar137._0_4_;
          auVar66._8_4_ = auVar23._8_4_ * auVar137._8_4_;
          auVar66._12_4_ = auVar23._12_4_ * auVar137._12_4_;
          auVar66._16_4_ = auVar23._16_4_ * auVar137._16_4_;
          auVar66._20_4_ = auVar23._20_4_ * auVar137._20_4_;
          auVar66._24_4_ = auVar23._24_4_ * auVar137._24_4_;
          auVar66._28_4_ = auVar137._28_4_;
          auVar20 = vfmsub231ps_fma(auVar66,auVar105,auVar124);
          auVar17 = vfmadd231ps_fma(ZEXT1632(auVar20),ZEXT832(0) << 0x20,ZEXT1632(auVar17));
          auVar19 = vfmadd231ps_fma(ZEXT1632(auVar17),ZEXT832(0) << 0x20,ZEXT1632(auVar19));
          auVar124 = vmaxps_avx(ZEXT1632(auVar18),ZEXT1632(auVar19));
          auVar124 = vcmpps_avx(auVar124,ZEXT832(0) << 0x20,2);
          auVar17 = vpackssdw_avx(auVar124._0_16_,auVar124._16_16_);
          auVar21 = vpand_avx(auVar17,auVar21);
          auVar203 = ZEXT1664(auVar21);
          auVar124 = vpmovsxwd_avx2(auVar21);
          if ((((((((auVar124 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar124 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar124 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar124 >> 0x7f,0) == '\0') &&
                (auVar124 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar124 >> 0xbf,0) == '\0') &&
              (auVar124 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar124[0x1f]) {
LAB_011a119b:
            auVar145._8_8_ = uStack_478;
            auVar145._0_8_ = local_480;
            auVar145._16_8_ = uStack_470;
            auVar145._24_8_ = uStack_468;
            auVar190 = ZEXT3264(auVar190._0_32_);
            auVar183 = ZEXT3264(auVar178);
          }
          else {
            auVar67._4_4_ = auVar136._4_4_ * auVar25._4_4_;
            auVar67._0_4_ = auVar136._0_4_ * auVar25._0_4_;
            auVar67._8_4_ = auVar136._8_4_ * auVar25._8_4_;
            auVar67._12_4_ = auVar136._12_4_ * auVar25._12_4_;
            auVar67._16_4_ = auVar136._16_4_ * auVar25._16_4_;
            auVar67._20_4_ = auVar136._20_4_ * auVar25._20_4_;
            auVar67._24_4_ = auVar136._24_4_ * auVar25._24_4_;
            auVar67._28_4_ = auVar124._28_4_;
            auVar100 = vfmsub231ps_fma(auVar67,auVar105,auVar22);
            auVar166._0_4_ = auVar23._0_4_ * auVar22._0_4_;
            auVar166._4_4_ = auVar23._4_4_ * auVar22._4_4_;
            auVar166._8_4_ = auVar23._8_4_ * auVar22._8_4_;
            auVar166._12_4_ = auVar23._12_4_ * auVar22._12_4_;
            auVar166._16_4_ = auVar23._16_4_ * auVar22._16_4_;
            auVar166._20_4_ = auVar23._20_4_ * auVar22._20_4_;
            auVar166._24_4_ = auVar23._24_4_ * auVar22._24_4_;
            auVar166._28_4_ = 0;
            auVar101 = vfmsub231ps_fma(auVar166,auVar182,auVar25);
            auVar68._4_4_ = auVar182._4_4_ * auVar105._4_4_;
            auVar68._0_4_ = auVar182._0_4_ * auVar105._0_4_;
            auVar68._8_4_ = auVar182._8_4_ * auVar105._8_4_;
            auVar68._12_4_ = auVar182._12_4_ * auVar105._12_4_;
            auVar68._16_4_ = auVar182._16_4_ * auVar105._16_4_;
            auVar68._20_4_ = auVar182._20_4_ * auVar105._20_4_;
            auVar68._24_4_ = auVar182._24_4_ * auVar105._24_4_;
            auVar68._28_4_ = auVar105._28_4_;
            auVar129 = vfmsub231ps_fma(auVar68,auVar23,auVar136);
            auVar17 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar101),ZEXT1632(auVar129));
            auVar20 = vfmadd231ps_fma(ZEXT1632(auVar17),ZEXT1632(auVar100),ZEXT832(0) << 0x20);
            auVar124 = vrcpps_avx(ZEXT1632(auVar20));
            auVar194._8_4_ = 0x3f800000;
            auVar194._0_8_ = 0x3f8000003f800000;
            auVar194._12_4_ = 0x3f800000;
            auVar194._16_4_ = 0x3f800000;
            auVar194._20_4_ = 0x3f800000;
            auVar194._24_4_ = 0x3f800000;
            auVar194._28_4_ = 0x3f800000;
            auVar17 = vfnmadd213ps_fma(auVar124,ZEXT1632(auVar20),auVar194);
            auVar17 = vfmadd132ps_fma(ZEXT1632(auVar17),auVar124,auVar124);
            auVar69._4_4_ = auVar129._4_4_ * auVar186._4_4_;
            auVar69._0_4_ = auVar129._0_4_ * auVar186._0_4_;
            auVar69._8_4_ = auVar129._8_4_ * auVar186._8_4_;
            auVar69._12_4_ = auVar129._12_4_ * auVar186._12_4_;
            auVar69._16_4_ = auVar186._16_4_ * 0.0;
            auVar69._20_4_ = auVar186._20_4_ * 0.0;
            auVar69._24_4_ = auVar186._24_4_ * 0.0;
            auVar69._28_4_ = auVar186._28_4_;
            auVar101 = vfmadd231ps_fma(auVar69,ZEXT1632(auVar101),local_660);
            auVar101 = vfmadd231ps_fma(ZEXT1632(auVar101),ZEXT1632(auVar100),auVar125);
            fVar110 = auVar17._0_4_;
            fVar111 = auVar17._4_4_;
            fVar112 = auVar17._8_4_;
            fVar113 = auVar17._12_4_;
            auVar137 = ZEXT1632(CONCAT412(fVar113 * auVar101._12_4_,
                                          CONCAT48(fVar112 * auVar101._8_4_,
                                                   CONCAT44(fVar111 * auVar101._4_4_,
                                                            fVar110 * auVar101._0_4_))));
            fVar128 = ray->tfar;
            auVar144._4_4_ = fVar128;
            auVar144._0_4_ = fVar128;
            auVar144._8_4_ = fVar128;
            auVar144._12_4_ = fVar128;
            auVar144._16_4_ = fVar128;
            auVar144._20_4_ = fVar128;
            auVar144._24_4_ = fVar128;
            auVar144._28_4_ = fVar128;
            auVar86._8_8_ = uStack_118;
            auVar86._0_8_ = local_120;
            auVar86._16_8_ = uStack_110;
            auVar86._24_8_ = uStack_108;
            auVar186 = vcmpps_avx(auVar86,auVar137,2);
            auVar124 = vcmpps_avx(auVar137,auVar144,2);
            auVar186 = vandps_avx(auVar124,auVar186);
            auVar17 = vpackssdw_avx(auVar186._0_16_,auVar186._16_16_);
            auVar21 = vpand_avx(auVar21,auVar17);
            auVar186 = vpmovsxwd_avx2(auVar21);
            if ((((((((auVar186 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar186 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar186 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar186 >> 0x7f,0) == '\0') &&
                  (auVar186 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar186 >> 0xbf,0) == '\0') &&
                (auVar186 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar186[0x1f]) goto LAB_011a119b;
            auVar186 = vcmpps_avx(ZEXT1632(auVar20),ZEXT832(0) << 0x20,4);
            auVar17 = vpackssdw_avx(auVar186._0_16_,auVar186._16_16_);
            auVar21 = vpand_avx(auVar21,auVar17);
            auVar186 = vpmovsxwd_avx2(auVar21);
            auVar145._8_8_ = uStack_478;
            auVar145._0_8_ = local_480;
            auVar145._16_8_ = uStack_470;
            auVar145._24_8_ = uStack_468;
            auVar190 = ZEXT3264(auVar190._0_32_);
            auVar183 = ZEXT3264(auVar178);
            if ((((((((auVar186 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar186 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar186 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar186 >> 0x7f,0) != '\0') ||
                  (auVar186 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar186 >> 0xbf,0) != '\0') ||
                (auVar186 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar186[0x1f] < '\0') {
              auVar103 = ZEXT1632(CONCAT412(fVar113 * auVar18._12_4_,
                                            CONCAT48(fVar112 * auVar18._8_4_,
                                                     CONCAT44(fVar111 * auVar18._4_4_,
                                                              fVar110 * auVar18._0_4_))));
              auVar70._28_4_ = SUB84(uStack_468,4);
              auVar70._0_28_ =
                   ZEXT1628(CONCAT412(fVar113 * auVar19._12_4_,
                                      CONCAT48(fVar112 * auVar19._8_4_,
                                               CONCAT44(fVar111 * auVar19._4_4_,
                                                        fVar110 * auVar19._0_4_))));
              auVar173._8_4_ = 0x3f800000;
              auVar173._0_8_ = 0x3f8000003f800000;
              auVar173._12_4_ = 0x3f800000;
              auVar173._16_4_ = 0x3f800000;
              auVar173._20_4_ = 0x3f800000;
              auVar173._24_4_ = 0x3f800000;
              auVar173._28_4_ = 0x3f800000;
              auVar124 = vsubps_avx(auVar173,auVar103);
              auVar124 = vblendvps_avx(auVar124,auVar103,auVar14);
              auVar190 = ZEXT3264(auVar124);
              auVar124 = vsubps_avx(auVar173,auVar70);
              local_3a0 = vblendvps_avx(auVar124,auVar70,auVar14);
              auVar183 = ZEXT3264(auVar137);
              auVar145 = auVar186;
            }
          }
          auVar205 = ZEXT3264(local_5a0);
          auVar197 = ZEXT3264(local_700);
          auVar195 = ZEXT3264(local_6a0);
          auVar187 = ZEXT3264(local_6e0);
          if ((((((((auVar145 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar145 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar145 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar145 >> 0x7f,0) == '\0') &&
                (auVar145 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar145 >> 0xbf,0) == '\0') &&
              (auVar145 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar145[0x1f]) goto LAB_011a0daf;
          auVar186 = vsubps_avx(ZEXT1632(auVar16),local_740);
          local_280 = auVar190._0_32_;
          auVar21 = vfmadd213ps_fma(auVar186,local_280,local_740);
          fVar128 = local_708->depth_scale;
          auVar71._4_4_ = (auVar21._4_4_ + auVar21._4_4_) * fVar128;
          auVar71._0_4_ = (auVar21._0_4_ + auVar21._0_4_) * fVar128;
          auVar71._8_4_ = (auVar21._8_4_ + auVar21._8_4_) * fVar128;
          auVar71._12_4_ = (auVar21._12_4_ + auVar21._12_4_) * fVar128;
          auVar71._16_4_ = fVar128 * 0.0;
          auVar71._20_4_ = fVar128 * 0.0;
          auVar71._24_4_ = fVar128 * 0.0;
          auVar71._28_4_ = fVar128;
          local_240 = auVar183._0_32_;
          auVar186 = vcmpps_avx(local_240,auVar71,6);
          auVar124 = auVar145 & auVar186;
          auVar167 = ZEXT3264(CONCAT428(fStack_544,
                                        CONCAT424(fStack_548,
                                                  CONCAT420(fStack_54c,
                                                            CONCAT416(fStack_550,
                                                                      CONCAT412(fStack_554,
                                                                                CONCAT48(fStack_558,
                                                                                         CONCAT44(
                                                  fStack_55c,local_560))))))));
          auVar171 = ZEXT3264(CONCAT428(fStack_564,
                                        CONCAT424(fStack_568,
                                                  CONCAT420(fStack_56c,
                                                            CONCAT416(fStack_570,
                                                                      CONCAT412(fStack_574,
                                                                                CONCAT48(fStack_578,
                                                                                         CONCAT44(
                                                  fStack_57c,local_580))))))));
          auVar174 = ZEXT3264(local_620);
          if ((((((((auVar124 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar124 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar124 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar124 >> 0x7f,0) == '\0') &&
                (auVar124 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar124 >> 0xbf,0) == '\0') &&
              (auVar124 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar124[0x1f]) {
            auVar127 = ZEXT3264(local_640);
            goto LAB_011a0dca;
          }
          auVar126._8_4_ = 0xbf800000;
          auVar126._0_8_ = 0xbf800000bf800000;
          auVar126._12_4_ = 0xbf800000;
          auVar126._16_4_ = 0xbf800000;
          auVar126._20_4_ = 0xbf800000;
          auVar126._24_4_ = 0xbf800000;
          auVar126._28_4_ = 0xbf800000;
          auVar139._8_4_ = 0x40000000;
          auVar139._0_8_ = 0x4000000040000000;
          auVar139._12_4_ = 0x40000000;
          auVar139._16_4_ = 0x40000000;
          auVar139._20_4_ = 0x40000000;
          auVar139._24_4_ = 0x40000000;
          auVar139._28_4_ = 0x40000000;
          auVar21 = vfmadd213ps_fma(local_3a0,auVar139,auVar126);
          local_260 = ZEXT1632(auVar21);
          local_21c = iVar11;
          local_210 = local_5e0;
          uStack_208 = uStack_5d8;
          local_200 = local_5f0;
          uStack_1f8 = uStack_5e8;
          local_1f0 = local_600;
          uStack_1e8 = uStack_5f8;
          pGVar12 = (context->scene->geometries).items[local_710].ptr;
          local_3a0 = ZEXT1632(auVar21);
          auVar124 = local_3a0;
          if ((pGVar12->mask & ray->mask) == 0) {
            pRVar89 = (RTCIntersectArguments *)0x0;
            auVar127 = ZEXT3264(local_640);
          }
          else {
            pRVar89 = context->args;
            auVar127 = ZEXT3264(local_640);
            if ((pRVar89->filter != (RTCFilterFunctionN)0x0) ||
               (pRVar89 = (RTCIntersectArguments *)CONCAT71((int7)((ulong)pRVar89 >> 8),1),
               pGVar12->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              local_520 = ZEXT1632(CONCAT88(auVar148._8_8_,pGVar12));
              _auStack_778 = auVar125._8_24_;
              local_780 = (undefined1  [8])context;
              auVar125 = vandps_avx(auVar186,auVar145);
              local_680 = local_280;
              fVar128 = (float)local_220;
              local_1a0[0] = (fVar128 + auVar190._0_4_ + 0.0) * local_140;
              local_1a0[1] = (fVar128 + auVar190._4_4_ + 1.0) * fStack_13c;
              local_1a0[2] = (fVar128 + auVar190._8_4_ + 2.0) * fStack_138;
              local_1a0[3] = (fVar128 + auVar190._12_4_ + 3.0) * fStack_134;
              fStack_190 = (fVar128 + auVar190._16_4_ + 4.0) * fStack_130;
              fStack_18c = (fVar128 + auVar190._20_4_ + 5.0) * fStack_12c;
              fStack_188 = (fVar128 + auVar190._24_4_ + 6.0) * fStack_128;
              fStack_184 = fVar128 + auVar190._28_4_ + 7.0;
              local_3a0._0_8_ = auVar21._0_8_;
              local_3a0._8_8_ = auVar21._8_8_;
              local_180 = local_3a0._0_8_;
              uStack_178 = local_3a0._8_8_;
              uStack_170 = 0;
              uStack_168 = 0;
              local_6c0 = local_240;
              local_160 = local_240;
              uVar95 = vmovmskps_avx(auVar125);
              uVar90 = CONCAT44((int)((ulong)pRVar89 >> 0x20),uVar95);
              local_3a0 = auVar124;
              do {
                lVar26 = 0;
                for (uVar92 = uVar90; (uVar92 & 1) == 0; uVar92 = uVar92 >> 1 | 0x8000000000000000)
                {
                  lVar26 = lVar26 + 1;
                }
                local_740._0_8_ = lVar26;
                local_760._0_8_ = uVar90;
                if (uVar90 == 0) {
                  pRVar89 = (RTCIntersectArguments *)0x0;
                  goto LAB_011a11e5;
                }
                local_4d4 = local_1a0[lVar26];
                local_4d0 = *(undefined4 *)((long)&local_180 + lVar26 * 4);
                local_660._0_4_ = ray->tfar;
                ray->tfar = *(float *)(local_160 + lVar26 * 4);
                local_5d0.context = *(RTCRayQueryContext **)((long)local_780 + 8);
                fVar110 = 1.0 - local_4d4;
                fVar128 = fVar110 * fVar110 * -3.0;
                auVar21 = vfmadd231ss_fma(ZEXT416((uint)(fVar110 * fVar110)),
                                          ZEXT416((uint)(local_4d4 * fVar110)),ZEXT416(0xc0000000));
                auVar16 = vfmsub132ss_fma(ZEXT416((uint)(local_4d4 * fVar110)),
                                          ZEXT416((uint)(local_4d4 * local_4d4)),ZEXT416(0x40000000)
                                         );
                fVar110 = auVar21._0_4_ * 3.0;
                fVar111 = auVar16._0_4_ * 3.0;
                fVar112 = local_4d4 * local_4d4 * 3.0;
                auVar156._0_4_ = fVar112 * local_4a0;
                auVar156._4_4_ = fVar112 * fStack_49c;
                auVar156._8_4_ = fVar112 * fStack_498;
                auVar156._12_4_ = fVar112 * fStack_494;
                auVar133._4_4_ = fVar111;
                auVar133._0_4_ = fVar111;
                auVar133._8_4_ = fVar111;
                auVar133._12_4_ = fVar111;
                auVar78._8_8_ = uStack_5f8;
                auVar78._0_8_ = local_600;
                auVar21 = vfmadd132ps_fma(auVar133,auVar156,auVar78);
                auVar143._4_4_ = fVar110;
                auVar143._0_4_ = fVar110;
                auVar143._8_4_ = fVar110;
                auVar143._12_4_ = fVar110;
                auVar80._8_8_ = uStack_5e8;
                auVar80._0_8_ = local_5f0;
                auVar21 = vfmadd132ps_fma(auVar143,auVar21,auVar80);
                auVar134._4_4_ = fVar128;
                auVar134._0_4_ = fVar128;
                auVar134._8_4_ = fVar128;
                auVar134._12_4_ = fVar128;
                auVar82._8_8_ = uStack_5d8;
                auVar82._0_8_ = local_5e0;
                auVar21 = vfmadd132ps_fma(auVar134,auVar21,auVar82);
                local_4e0 = vmovlps_avx(auVar21);
                local_4d8 = vextractps_avx(auVar21,2);
                local_4cc = (int)local_4a8;
                local_4c8 = (int)local_710;
                local_4c4 = (local_5d0.context)->instID[0];
                local_4c0 = (local_5d0.context)->instPrimID[0];
                local_794 = -1;
                local_5d0.valid = &local_794;
                local_5d0.geometryUserPtr = *(void **)(local_520._0_8_ + 0x18);
                local_5d0.ray = (RTCRayN *)ray;
                local_5d0.hit = (RTCHitN *)&local_4e0;
                local_5d0.N = 1;
                if (*(code **)(local_520._0_8_ + 0x48) == (code *)0x0) {
LAB_011a111c:
                  p_Var13 = (*(RTCIntersectArguments **)((long)local_780 + 0x10))->filter;
                  if ((p_Var13 == (RTCFilterFunctionN)0x0) ||
                     ((((*(RTCIntersectArguments **)((long)local_780 + 0x10))->flags &
                       RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) == RTC_RAY_QUERY_FLAG_INCOHERENT
                      && ((*(byte *)(local_520._0_8_ + 0x3e) & 0x40) == 0)))) goto LAB_011a11df;
                  auVar203 = ZEXT1664(auVar203._0_16_);
                  (*p_Var13)(&local_5d0);
                  if (*local_5d0.valid != 0) goto LAB_011a11df;
                }
                else {
                  auVar203 = ZEXT1664(auVar203._0_16_);
                  (**(code **)(local_520._0_8_ + 0x48))(&local_5d0);
                  if (*local_5d0.valid != 0) goto LAB_011a111c;
                }
                ray->tfar = (float)local_660._0_4_;
                uVar90 = local_760._0_8_ ^ 1L << (local_740._0_8_ & 0x3f);
              } while( true );
            }
          }
          goto LAB_011a1193;
        }
        auVar183 = ZEXT3264(auVar178);
LAB_011a0daf:
        auVar205 = ZEXT3264(local_5a0);
        auVar197 = ZEXT3264(local_700);
        auVar195 = ZEXT3264(local_6a0);
        auVar187 = ZEXT3264(local_6e0);
        auVar127 = ZEXT3264(local_640);
        auVar167 = ZEXT3264(CONCAT428(fStack_544,
                                      CONCAT424(fStack_548,
                                                CONCAT420(fStack_54c,
                                                          CONCAT416(fStack_550,
                                                                    CONCAT412(fStack_554,
                                                                              CONCAT48(fStack_558,
                                                                                       CONCAT44(
                                                  fStack_55c,local_560))))))));
        auVar171 = ZEXT3264(CONCAT428(fStack_564,
                                      CONCAT424(fStack_568,
                                                CONCAT420(fStack_56c,
                                                          CONCAT416(fStack_570,
                                                                    CONCAT412(fStack_574,
                                                                              CONCAT48(fStack_578,
                                                                                       CONCAT44(
                                                  fStack_57c,local_580))))))));
        auVar174 = ZEXT3264(local_620);
        goto LAB_011a0dca;
      }
    }
    if (bVar94 != 0) break;
    fVar128 = ray->tfar;
    auVar102._4_4_ = fVar128;
    auVar102._0_4_ = fVar128;
    auVar102._8_4_ = fVar128;
    auVar102._12_4_ = fVar128;
    auVar21 = vcmpps_avx(local_2a0,auVar102,2);
    uVar88 = vmovmskps_avx(auVar21);
    local_488 = (ulong)((uint)uVar96 & uVar88);
  }
  return local_488 != 0;
LAB_011a11df:
  pRVar89 = (RTCIntersectArguments *)0x1;
LAB_011a11e5:
  auVar190 = ZEXT3264(local_680);
  auVar183 = ZEXT3264(local_6c0);
  auVar187 = ZEXT3264(local_6e0);
  auVar197 = ZEXT3264(local_700);
  auVar127 = ZEXT3264(local_640);
  auVar195 = ZEXT3264(local_6a0);
  auVar205 = ZEXT3264(local_5a0);
  auVar167 = ZEXT3264(CONCAT428(fStack_544,
                                CONCAT424(fStack_548,
                                          CONCAT420(fStack_54c,
                                                    CONCAT416(fStack_550,
                                                              CONCAT412(fStack_554,
                                                                        CONCAT48(fStack_558,
                                                                                 CONCAT44(fStack_55c
                                                                                          ,local_560
                                                                                         ))))))));
  auVar171 = ZEXT3264(CONCAT428(fStack_564,
                                CONCAT424(fStack_568,
                                          CONCAT420(fStack_56c,
                                                    CONCAT416(fStack_570,
                                                              CONCAT412(fStack_574,
                                                                        CONCAT48(fStack_578,
                                                                                 CONCAT44(fStack_57c
                                                                                          ,local_580
                                                                                         ))))))));
  auVar174 = ZEXT3264(local_620);
  context = (RayQueryContext *)local_780;
LAB_011a1193:
  bVar94 = bVar94 | (byte)pRVar89;
LAB_011a0dca:
  lVar91 = lVar91 + 8;
  auVar146 = ZEXT3264(local_500);
  goto LAB_011a05d9;
}

Assistant:

static __forceinline bool occluded_t(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));
         
          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }